

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx512::ConeCurveMiIntersectorK<8,_16,_true>::intersect
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  byte bVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  ulong uVar96;
  byte bVar97;
  byte bVar98;
  uint uVar99;
  uint uVar100;
  undefined1 auVar101 [8];
  uint uVar102;
  byte bVar103;
  ulong uVar104;
  ulong uVar105;
  byte bVar106;
  ulong uVar107;
  ulong uVar108;
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar176;
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  float fVar177;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar178 [64];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined4 uVar189;
  undefined1 auVar190 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  RayQueryContext *local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  uint local_740 [4];
  uint uStack_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  uint local_6c0 [4];
  uint uStack_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  uint local_6a0 [4];
  uint uStack_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  int iVar109;
  int iVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  undefined1 auVar191 [64];
  
  pSVar10 = context->scene;
  pGVar11 = (pSVar10->geometries).items[line->sharedGeomID].ptr;
  uVar99 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar100 = (line->v0).field_0.i[1];
  uVar102 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[4];
  auVar123._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar123._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar99 * (long)p_Var13);
  uVar7 = (line->v0).field_0.i[5];
  auVar141._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar141._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar100 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar119._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar119._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar102 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[7];
  auVar120._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar120._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * (long)p_Var13);
  auVar110 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar134._0_16_ =
       ZEXT116(0) * auVar110 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar99 + 1) * (long)p_Var13);
  auVar134._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110;
  auVar110 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar164._0_16_ =
       ZEXT116(0) * auVar110 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar100 + 1) * (long)p_Var13);
  auVar164._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110;
  auVar110 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar166._0_16_ =
       ZEXT116(0) * auVar110 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar102 + 1) * (long)p_Var13);
  auVar166._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110;
  auVar110 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar168._0_16_ =
       ZEXT116(0) * auVar110 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * (long)p_Var13);
  auVar168._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110;
  local_360 = vpbroadcastd_avx512vl();
  auVar116 = vunpcklps_avx(auVar123,auVar119);
  auVar114 = vunpckhps_avx(auVar123,auVar119);
  auVar123 = vunpcklps_avx(auVar141,auVar120);
  auVar115 = vunpckhps_avx(auVar141,auVar120);
  auVar119 = vunpcklps_avx(auVar116,auVar123);
  auVar123 = vunpckhps_avx(auVar116,auVar123);
  auVar120 = vunpcklps_avx(auVar114,auVar115);
  auVar141 = vunpckhps_avx(auVar114,auVar115);
  auVar116 = vpunpckldq_avx2(auVar134,auVar166);
  auVar114 = vpunpckhdq_avx2(auVar134,auVar166);
  auVar134 = vpunpckldq_avx2(auVar164,auVar168);
  auVar115 = vpunpckhdq_avx2(auVar164,auVar168);
  auVar166 = vpunpckldq_avx2(auVar116,auVar134);
  auVar134 = vpunpckhdq_avx2(auVar116,auVar134);
  auVar168 = vpunpckldq_avx2(auVar114,auVar115);
  auVar164 = vpunpckhdq_avx2(auVar114,auVar115);
  auVar114 = vpcmpeqd_avx2(auVar116,auVar116);
  uVar96 = vpcmpd_avx512vl(auVar114,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar118._4_4_ = fVar1;
  auVar118._0_4_ = fVar1;
  auVar118._8_4_ = fVar1;
  auVar118._12_4_ = fVar1;
  auVar118._16_4_ = fVar1;
  auVar118._20_4_ = fVar1;
  auVar118._24_4_ = fVar1;
  auVar118._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar121._4_4_ = fVar2;
  auVar121._0_4_ = fVar2;
  auVar121._8_4_ = fVar2;
  auVar121._12_4_ = fVar2;
  auVar121._16_4_ = fVar2;
  auVar121._20_4_ = fVar2;
  auVar121._24_4_ = fVar2;
  auVar121._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x80);
  auVar122._4_4_ = fVar3;
  auVar122._0_4_ = fVar3;
  auVar122._8_4_ = fVar3;
  auVar122._12_4_ = fVar3;
  auVar122._16_4_ = fVar3;
  auVar122._20_4_ = fVar3;
  auVar122._24_4_ = fVar3;
  auVar122._28_4_ = fVar3;
  auVar111 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar200 = ZEXT3264(auVar111);
  auVar112 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar201 = ZEXT3264(auVar112);
  auVar113 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar202 = ZEXT3264(auVar113);
  auVar110 = vmulss_avx512f(auVar113._0_16_,auVar113._0_16_);
  auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar112,auVar112);
  auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
  auVar116._0_4_ = auVar114._0_4_;
  auVar116._4_4_ = auVar116._0_4_;
  auVar116._8_4_ = auVar116._0_4_;
  auVar116._12_4_ = auVar116._0_4_;
  auVar116._16_4_ = auVar116._0_4_;
  auVar116._20_4_ = auVar116._0_4_;
  auVar116._24_4_ = auVar116._0_4_;
  auVar116._28_4_ = auVar116._0_4_;
  auVar115 = vrcp14ps_avx512vl(auVar116);
  auVar114._8_4_ = 0x3f800000;
  auVar114._0_8_ = 0x3f8000003f800000;
  auVar114._12_4_ = 0x3f800000;
  auVar114._16_4_ = 0x3f800000;
  auVar114._20_4_ = 0x3f800000;
  auVar114._24_4_ = 0x3f800000;
  auVar114._28_4_ = 0x3f800000;
  auVar114 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar114);
  auVar110 = vfmadd132ps_fma(auVar114,auVar115,auVar115);
  auVar117._0_4_ = auVar119._0_4_ + auVar166._0_4_;
  auVar117._4_4_ = auVar119._4_4_ + auVar166._4_4_;
  auVar117._8_4_ = auVar119._8_4_ + auVar166._8_4_;
  auVar117._12_4_ = auVar119._12_4_ + auVar166._12_4_;
  auVar117._16_4_ = auVar119._16_4_ + auVar166._16_4_;
  auVar117._20_4_ = auVar119._20_4_ + auVar166._20_4_;
  auVar117._24_4_ = auVar119._24_4_ + auVar166._24_4_;
  auVar117._28_4_ = auVar119._28_4_ + auVar166._28_4_;
  auVar124._0_4_ = auVar134._0_4_ + auVar123._0_4_;
  auVar124._4_4_ = auVar134._4_4_ + auVar123._4_4_;
  auVar124._8_4_ = auVar134._8_4_ + auVar123._8_4_;
  auVar124._12_4_ = auVar134._12_4_ + auVar123._12_4_;
  auVar124._16_4_ = auVar134._16_4_ + auVar123._16_4_;
  auVar124._20_4_ = auVar134._20_4_ + auVar123._20_4_;
  auVar124._24_4_ = auVar134._24_4_ + auVar123._24_4_;
  auVar124._28_4_ = auVar134._28_4_ + auVar123._28_4_;
  auVar125._0_4_ = auVar120._0_4_ + auVar168._0_4_;
  auVar125._4_4_ = auVar120._4_4_ + auVar168._4_4_;
  auVar125._8_4_ = auVar120._8_4_ + auVar168._8_4_;
  auVar125._12_4_ = auVar120._12_4_ + auVar168._12_4_;
  auVar125._16_4_ = auVar120._16_4_ + auVar168._16_4_;
  auVar125._20_4_ = auVar120._20_4_ + auVar168._20_4_;
  auVar125._24_4_ = auVar120._24_4_ + auVar168._24_4_;
  auVar125._28_4_ = auVar120._28_4_ + auVar168._28_4_;
  auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar115 = vmulps_avx512vl(auVar117,auVar114);
  auVar116 = vmulps_avx512vl(auVar124,auVar114);
  auVar117 = vmulps_avx512vl(auVar125,auVar114);
  auVar114 = vsubps_avx(auVar115,auVar118);
  auVar115 = vsubps_avx(auVar116,auVar121);
  auVar116 = vsubps_avx(auVar117,auVar122);
  auVar116 = vmulps_avx512vl(auVar116,auVar113);
  auVar115 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar115);
  auVar114 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar114);
  auVar152._0_4_ = auVar114._0_4_ * auVar110._0_4_;
  auVar152._4_4_ = auVar114._4_4_ * auVar110._4_4_;
  auVar152._8_4_ = auVar114._8_4_ * auVar110._8_4_;
  auVar152._12_4_ = auVar114._12_4_ * auVar110._12_4_;
  auVar152._16_4_ = auVar114._16_4_ * 0.0;
  auVar152._20_4_ = auVar114._20_4_ * 0.0;
  auVar152._24_4_ = auVar114._24_4_ * 0.0;
  auVar152._28_4_ = 0;
  auVar114 = vmulps_avx512vl(auVar111,auVar152);
  auVar115 = vmulps_avx512vl(auVar112,auVar152);
  auVar116 = vmulps_avx512vl(auVar113,auVar152);
  auVar128._0_4_ = auVar114._0_4_ + fVar1;
  auVar128._4_4_ = auVar114._4_4_ + fVar1;
  auVar128._8_4_ = auVar114._8_4_ + fVar1;
  auVar128._12_4_ = auVar114._12_4_ + fVar1;
  auVar128._16_4_ = auVar114._16_4_ + fVar1;
  auVar128._20_4_ = auVar114._20_4_ + fVar1;
  auVar128._24_4_ = auVar114._24_4_ + fVar1;
  auVar128._28_4_ = auVar114._28_4_ + fVar1;
  auVar129._0_4_ = auVar115._0_4_ + fVar2;
  auVar129._4_4_ = auVar115._4_4_ + fVar2;
  auVar129._8_4_ = auVar115._8_4_ + fVar2;
  auVar129._12_4_ = auVar115._12_4_ + fVar2;
  auVar129._16_4_ = auVar115._16_4_ + fVar2;
  auVar129._20_4_ = auVar115._20_4_ + fVar2;
  auVar129._24_4_ = auVar115._24_4_ + fVar2;
  auVar129._28_4_ = auVar115._28_4_ + fVar2;
  auVar130._0_4_ = fVar3 + auVar116._0_4_;
  auVar130._4_4_ = fVar3 + auVar116._4_4_;
  auVar130._8_4_ = fVar3 + auVar116._8_4_;
  auVar130._12_4_ = fVar3 + auVar116._12_4_;
  auVar130._16_4_ = fVar3 + auVar116._16_4_;
  auVar130._20_4_ = fVar3 + auVar116._20_4_;
  auVar130._24_4_ = fVar3 + auVar116._24_4_;
  auVar130._28_4_ = fVar3 + auVar116._28_4_;
  auVar116 = vsubps_avx512vl(auVar166,auVar119);
  auVar203 = ZEXT3264(auVar116);
  auVar117 = vsubps_avx512vl(auVar134,auVar123);
  auVar204 = ZEXT3264(auVar117);
  auVar118 = vsubps_avx512vl(auVar168,auVar120);
  auVar205 = ZEXT3264(auVar118);
  _local_7e0 = vsubps_avx512vl(auVar128,auVar119);
  _local_7a0 = vsubps_avx(auVar129,auVar123);
  auVar119 = vsubps_avx512vl(auVar130,auVar120);
  auVar208 = ZEXT3264(auVar119);
  auVar114 = vmulps_avx512vl(auVar118,auVar118);
  auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,auVar117);
  auVar120 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar116);
  auVar114 = vmulps_avx512vl(auVar118,auVar119);
  auVar114 = vfmadd231ps_avx512vl(auVar114,_local_7a0,auVar117);
  auVar121 = vfmadd231ps_avx512vl(auVar114,_local_7e0,auVar116);
  auVar114 = vmulps_avx512vl(auVar118,auVar113);
  auVar114 = vfmadd231ps_avx512vl(auVar114,auVar112,auVar117);
  auVar122 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar116);
  auVar114 = vsubps_avx(auVar141,auVar164);
  fVar1 = auVar114._0_4_;
  fVar3 = auVar114._4_4_;
  fVar62 = auVar114._8_4_;
  fVar65 = auVar114._12_4_;
  fVar68 = auVar114._16_4_;
  fVar71 = auVar114._20_4_;
  fVar74 = auVar114._24_4_;
  auVar158._0_4_ = fVar1 * fVar1 + auVar120._0_4_;
  auVar158._4_4_ = fVar3 * fVar3 + auVar120._4_4_;
  auVar158._8_4_ = fVar62 * fVar62 + auVar120._8_4_;
  auVar158._12_4_ = fVar65 * fVar65 + auVar120._12_4_;
  auVar158._16_4_ = fVar68 * fVar68 + auVar120._16_4_;
  auVar158._20_4_ = fVar71 * fVar71 + auVar120._20_4_;
  auVar158._24_4_ = fVar74 * fVar74 + auVar120._24_4_;
  auVar158._28_4_ = auVar123._28_4_ + auVar120._28_4_;
  auVar115 = vmulps_avx512vl(auVar113,auVar119);
  auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,_local_7a0);
  auVar123 = vfmadd231ps_avx512vl(auVar115,auVar111,_local_7e0);
  auVar115 = vmulps_avx512vl(auVar119,auVar119);
  auVar115 = vfmadd231ps_avx512vl(auVar115,_local_7a0,_local_7a0);
  auVar124 = vfmadd231ps_avx512vl(auVar115,_local_7e0,_local_7e0);
  auVar125 = vmulps_avx512vl(auVar120,auVar120);
  auVar209 = ZEXT3264(auVar125);
  auVar126 = vmulps_avx512vl(auVar141,auVar120);
  fVar2 = auVar122._0_4_;
  fVar177 = fVar2 * fVar2;
  fVar60 = auVar122._4_4_;
  fVar179 = fVar60 * fVar60;
  auVar115._4_4_ = fVar179;
  auVar115._0_4_ = fVar177;
  fVar63 = auVar122._8_4_;
  fVar180 = fVar63 * fVar63;
  auVar115._8_4_ = fVar180;
  fVar66 = auVar122._12_4_;
  fVar181 = fVar66 * fVar66;
  auVar115._12_4_ = fVar181;
  fVar69 = auVar122._16_4_;
  fVar182 = fVar69 * fVar69;
  auVar115._16_4_ = fVar182;
  fVar72 = auVar122._20_4_;
  fVar183 = fVar72 * fVar72;
  auVar115._20_4_ = fVar183;
  fVar75 = auVar122._24_4_;
  fVar184 = fVar75 * fVar75;
  auVar115._24_4_ = fVar184;
  auVar115._28_4_ = local_7a0._28_4_;
  auVar115 = vmulps_avx512vl(auVar158,auVar115);
  auVar115 = vsubps_avx512vl(auVar125,auVar115);
  auVar123 = vmulps_avx512vl(auVar125,auVar123);
  auVar127 = vmulps_avx512vl(auVar122,auVar121);
  auVar127 = vmulps_avx512vl(auVar158,auVar127);
  auVar123 = vsubps_avx512vl(auVar123,auVar127);
  auVar127 = vmulps_avx512vl(auVar114,auVar122);
  auVar127 = vmulps_avx512vl(auVar126,auVar127);
  auVar123 = vaddps_avx512vl(auVar127,auVar123);
  auVar124 = vmulps_avx512vl(auVar125,auVar124);
  auVar127 = vmulps_avx512vl(auVar121,auVar121);
  auVar127 = vmulps_avx512vl(auVar158,auVar127);
  auVar124 = vsubps_avx512vl(auVar124,auVar127);
  auVar114 = vaddps_avx512vl(auVar114,auVar114);
  auVar114 = vmulps_avx512vl(auVar114,auVar121);
  auVar114 = vsubps_avx512vl(auVar114,auVar126);
  auVar114 = vmulps_avx512vl(auVar126,auVar114);
  auVar114 = vaddps_avx512vl(auVar124,auVar114);
  auVar124 = vmulps_avx512vl(auVar123,auVar123);
  auVar114 = vmulps_avx512vl(auVar115,auVar114);
  auVar114 = vsubps_avx512vl(auVar124,auVar114);
  auVar124 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar108 = vcmpps_avx512vl(auVar114,auVar124,5);
  bVar98 = (byte)(uVar96 & uVar108);
  if (bVar98 != 0) {
    auVar166 = vsubps_avx(auVar128,auVar166);
    auVar134 = vsubps_avx(auVar129,auVar134);
    auVar168 = vsubps_avx(auVar130,auVar168);
    auVar128 = vsqrtps_avx512vl(auVar114);
    auVar129 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar114 = vrcp14ps_avx512vl(auVar115);
    auVar130 = vfnmadd213ps_avx512vl(auVar114,auVar115,auVar129);
    auVar126._8_4_ = 0x7fffffff;
    auVar126._0_8_ = 0x7fffffff7fffffff;
    auVar126._12_4_ = 0x7fffffff;
    auVar126._16_4_ = 0x7fffffff;
    auVar126._20_4_ = 0x7fffffff;
    auVar126._24_4_ = 0x7fffffff;
    auVar126._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar115,auVar126);
    auVar127._8_4_ = 0x219392ef;
    auVar127._0_8_ = 0x219392ef219392ef;
    auVar127._12_4_ = 0x219392ef;
    auVar127._16_4_ = 0x219392ef;
    auVar127._20_4_ = 0x219392ef;
    auVar127._24_4_ = 0x219392ef;
    auVar127._28_4_ = 0x219392ef;
    uVar104 = vcmpps_avx512vl(auVar130,auVar127,2);
    auVar115 = vfmadd132ps_avx512vl(auVar130,auVar114,auVar114);
    auVar165._8_4_ = 0x80000000;
    auVar165._0_8_ = 0x8000000080000000;
    auVar165._12_4_ = 0x80000000;
    auVar165._16_4_ = 0x80000000;
    auVar165._20_4_ = 0x80000000;
    auVar165._24_4_ = 0x80000000;
    auVar165._28_4_ = 0x80000000;
    auVar114 = vxorps_avx512vl(auVar123,auVar165);
    auVar114 = vsubps_avx(auVar114,auVar128);
    auVar114 = vmulps_avx512vl(auVar114,auVar115);
    auVar187._8_4_ = 0xff800000;
    auVar187._0_8_ = 0xff800000ff800000;
    auVar187._12_4_ = 0xff800000;
    auVar187._16_4_ = 0xff800000;
    auVar187._20_4_ = 0xff800000;
    auVar187._24_4_ = 0xff800000;
    auVar187._28_4_ = 0xff800000;
    bVar14 = (bool)((byte)uVar104 & 1);
    auVar131._0_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar114._0_4_;
    bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar114._4_4_;
    bVar14 = (bool)((byte)(uVar104 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar114._8_4_;
    bVar14 = (bool)((byte)(uVar104 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar114._12_4_;
    bVar14 = (bool)((byte)(uVar104 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar114._16_4_;
    bVar14 = (bool)((byte)(uVar104 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar114._20_4_;
    bVar14 = (bool)((byte)(uVar104 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar114._24_4_;
    bVar14 = SUB81(uVar104 >> 7,0);
    auVar131._28_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar114._28_4_;
    auVar114 = vsubps_avx512vl(auVar128,auVar123);
    auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar199 = ZEXT3264(auVar126);
    auVar114 = vmulps_avx512vl(auVar114,auVar115);
    bVar14 = (bool)((byte)uVar104 & 1);
    iVar109 = auVar126._0_4_;
    auVar132._0_4_ = (uint)bVar14 * iVar109 | (uint)!bVar14 * auVar114._0_4_;
    bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
    iVar145 = auVar126._4_4_;
    auVar132._4_4_ = (uint)bVar14 * iVar145 | (uint)!bVar14 * auVar114._4_4_;
    bVar14 = (bool)((byte)(uVar104 >> 2) & 1);
    iVar146 = auVar126._8_4_;
    auVar132._8_4_ = (uint)bVar14 * iVar146 | (uint)!bVar14 * auVar114._8_4_;
    bVar14 = (bool)((byte)(uVar104 >> 3) & 1);
    iVar147 = auVar126._12_4_;
    auVar132._12_4_ = (uint)bVar14 * iVar147 | (uint)!bVar14 * auVar114._12_4_;
    bVar14 = (bool)((byte)(uVar104 >> 4) & 1);
    iVar148 = auVar126._16_4_;
    auVar132._16_4_ = (uint)bVar14 * iVar148 | (uint)!bVar14 * auVar114._16_4_;
    bVar14 = (bool)((byte)(uVar104 >> 5) & 1);
    iVar149 = auVar126._20_4_;
    auVar132._20_4_ = (uint)bVar14 * iVar149 | (uint)!bVar14 * auVar114._20_4_;
    bVar14 = (bool)((byte)(uVar104 >> 6) & 1);
    iVar150 = auVar126._24_4_;
    auVar132._24_4_ = (uint)bVar14 * iVar150 | (uint)!bVar14 * auVar114._24_4_;
    bVar14 = SUB81(uVar104 >> 7,0);
    iVar151 = auVar126._28_4_;
    auVar132._28_4_ = (uint)bVar14 * iVar151 | (uint)!bVar14 * auVar114._28_4_;
    auVar114 = vmulps_avx512vl(auVar122,auVar131);
    auVar185._0_4_ = auVar121._0_4_ + auVar114._0_4_;
    auVar185._4_4_ = auVar121._4_4_ + auVar114._4_4_;
    auVar185._8_4_ = auVar121._8_4_ + auVar114._8_4_;
    auVar185._12_4_ = auVar121._12_4_ + auVar114._12_4_;
    auVar185._16_4_ = auVar121._16_4_ + auVar114._16_4_;
    auVar185._20_4_ = auVar121._20_4_ + auVar114._20_4_;
    auVar185._24_4_ = auVar121._24_4_ + auVar114._24_4_;
    fVar176 = auVar121._28_4_;
    auVar185._28_4_ = fVar176 + auVar114._28_4_;
    auVar114 = vmulps_avx512vl(auVar122,auVar132);
    auVar127 = vaddps_avx512vl(auVar121,auVar114);
    auVar206 = ZEXT3264(auVar127);
    uVar77 = vcmpps_avx512vl(auVar185,auVar120,1);
    uVar78 = vcmpps_avx512vl(auVar185,auVar124,6);
    uVar79 = vcmpps_avx512vl(auVar127,auVar120,1);
    uVar80 = vcmpps_avx512vl(auVar127,auVar124,6);
    auVar178._0_4_ = fVar2 * (float)local_7e0._0_4_;
    auVar178._4_4_ = fVar60 * (float)local_7e0._4_4_;
    auVar178._8_4_ = fVar63 * fStack_7d8;
    auVar178._12_4_ = fVar66 * fStack_7d4;
    auVar178._16_4_ = fVar69 * fStack_7d0;
    auVar178._20_4_ = fVar72 * fStack_7cc;
    auVar178._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
    auVar178._24_4_ = fVar75 * fStack_7c8;
    auVar114 = vmulps_avx512vl(auVar122,_local_7a0);
    auVar115 = vmulps_avx512vl(auVar122,auVar119);
    auVar123 = vmulps_avx512vl(auVar111,auVar121);
    auVar123 = vsubps_avx512vl(auVar178._0_32_,auVar123);
    auVar124 = vmulps_avx512vl(auVar112,auVar121);
    auVar114 = vsubps_avx512vl(auVar114,auVar124);
    auVar124 = vmulps_avx512vl(auVar113,auVar121);
    auVar115 = vsubps_avx512vl(auVar115,auVar124);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,auVar123);
    fVar59 = auVar141._0_4_;
    fVar61 = auVar141._4_4_;
    fVar64 = auVar141._8_4_;
    fVar67 = auVar141._12_4_;
    fVar70 = auVar141._16_4_;
    fVar73 = auVar141._20_4_;
    fVar76 = auVar141._24_4_;
    auVar82._4_4_ = fVar61 * fVar61 * fVar179;
    auVar82._0_4_ = fVar59 * fVar59 * fVar177;
    auVar82._8_4_ = fVar64 * fVar64 * fVar180;
    auVar82._12_4_ = fVar67 * fVar67 * fVar181;
    auVar82._16_4_ = fVar70 * fVar70 * fVar182;
    auVar82._20_4_ = fVar73 * fVar73 * fVar183;
    auVar82._24_4_ = fVar76 * fVar76 * fVar184;
    auVar82._28_4_ = auVar123._28_4_;
    uVar104 = vcmpps_avx512vl(auVar114,auVar82,1);
    uVar104 = (bVar98 & ~(byte)line->leftExists) & uVar104;
    auVar114 = vrcp14ps_avx512vl(auVar122);
    auVar115 = vfnmadd213ps_avx512vl(auVar114,auVar122,auVar129);
    auVar124 = vfmadd132ps_avx512vl(auVar115,auVar114,auVar114);
    auVar171._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
    auVar171._8_4_ = -auVar121._8_4_;
    auVar171._12_4_ = -auVar121._12_4_;
    auVar171._16_4_ = -auVar121._16_4_;
    auVar171._20_4_ = -auVar121._20_4_;
    auVar171._24_4_ = -auVar121._24_4_;
    auVar171._28_4_ = -fVar176;
    auVar114 = vmulps_avx512vl(auVar124,auVar171);
    bVar14 = (bool)((byte)uVar104 & 1);
    auVar133._0_4_ = (uint)bVar14 * auVar114._0_4_ | (uint)!bVar14 * iVar109;
    bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
    auVar133._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * iVar145;
    bVar14 = (bool)((byte)(uVar104 >> 2) & 1);
    auVar133._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * iVar146;
    bVar14 = (bool)((byte)(uVar104 >> 3) & 1);
    auVar133._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * iVar147;
    bVar14 = (bool)((byte)(uVar104 >> 4) & 1);
    auVar133._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * iVar148;
    bVar14 = (bool)((byte)(uVar104 >> 5) & 1);
    auVar133._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * iVar149;
    bVar14 = (bool)((byte)(uVar104 >> 6) & 1);
    auVar133._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * iVar150;
    bVar14 = SUB81(uVar104 >> 7,0);
    auVar133._28_4_ = (uint)bVar14 * auVar114._28_4_ | (uint)!bVar14 * iVar151;
    auVar198 = ZEXT3264(auVar133);
    auVar114 = vmulps_avx512vl(auVar118,auVar168);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar134,auVar117);
    auVar121 = vfmadd231ps_avx512vl(auVar114,auVar166,auVar116);
    auVar83._4_4_ = auVar166._4_4_ * fVar60;
    auVar83._0_4_ = auVar166._0_4_ * fVar2;
    auVar83._8_4_ = auVar166._8_4_ * fVar63;
    auVar83._12_4_ = auVar166._12_4_ * fVar66;
    auVar83._16_4_ = auVar166._16_4_ * fVar69;
    auVar83._20_4_ = auVar166._20_4_ * fVar72;
    auVar83._24_4_ = auVar166._24_4_ * fVar75;
    auVar83._28_4_ = fVar176;
    auVar84._4_4_ = auVar134._4_4_ * fVar60;
    auVar84._0_4_ = auVar134._0_4_ * fVar2;
    auVar84._8_4_ = auVar134._8_4_ * fVar63;
    auVar84._12_4_ = auVar134._12_4_ * fVar66;
    auVar84._16_4_ = auVar134._16_4_ * fVar69;
    auVar84._20_4_ = auVar134._20_4_ * fVar72;
    auVar84._24_4_ = auVar134._24_4_ * fVar75;
    auVar84._28_4_ = auVar166._28_4_;
    auVar85._4_4_ = auVar168._4_4_ * fVar60;
    auVar85._0_4_ = auVar168._0_4_ * fVar2;
    auVar85._8_4_ = auVar168._8_4_ * fVar63;
    auVar85._12_4_ = auVar168._12_4_ * fVar66;
    auVar85._16_4_ = auVar168._16_4_ * fVar69;
    auVar85._20_4_ = auVar168._20_4_ * fVar72;
    auVar85._24_4_ = auVar168._24_4_ * fVar75;
    auVar85._28_4_ = auVar122._28_4_;
    auVar114 = vmulps_avx512vl(auVar111,auVar121);
    auVar114 = vsubps_avx(auVar83,auVar114);
    auVar115 = vmulps_avx512vl(auVar112,auVar121);
    auVar115 = vsubps_avx(auVar84,auVar115);
    auVar134 = vmulps_avx512vl(auVar113,auVar121);
    auVar123 = vsubps_avx(auVar85,auVar134);
    auVar86._4_4_ = auVar123._4_4_ * auVar123._4_4_;
    auVar86._0_4_ = auVar123._0_4_ * auVar123._0_4_;
    auVar86._8_4_ = auVar123._8_4_ * auVar123._8_4_;
    auVar86._12_4_ = auVar123._12_4_ * auVar123._12_4_;
    auVar86._16_4_ = auVar123._16_4_ * auVar123._16_4_;
    auVar86._20_4_ = auVar123._20_4_ * auVar123._20_4_;
    auVar86._24_4_ = auVar123._24_4_ * auVar123._24_4_;
    auVar86._28_4_ = auVar123._28_4_;
    auVar110 = vfmadd231ps_fma(auVar86,auVar115,auVar115);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar114,auVar114);
    auVar87._4_4_ = fVar179 * auVar164._4_4_ * auVar164._4_4_;
    auVar87._0_4_ = fVar177 * auVar164._0_4_ * auVar164._0_4_;
    auVar87._8_4_ = fVar180 * auVar164._8_4_ * auVar164._8_4_;
    auVar87._12_4_ = fVar181 * auVar164._12_4_ * auVar164._12_4_;
    auVar87._16_4_ = fVar182 * auVar164._16_4_ * auVar164._16_4_;
    auVar87._20_4_ = fVar183 * auVar164._20_4_ * auVar164._20_4_;
    auVar87._24_4_ = fVar184 * auVar164._24_4_ * auVar164._24_4_;
    auVar87._28_4_ = auVar164._28_4_;
    uVar189 = *(undefined4 *)(ray + k * 4 + 0xc0);
    auVar174._4_4_ = uVar189;
    auVar174._0_4_ = uVar189;
    auVar174._8_4_ = uVar189;
    auVar174._12_4_ = uVar189;
    auVar174._16_4_ = uVar189;
    auVar174._20_4_ = uVar189;
    auVar174._24_4_ = uVar189;
    auVar174._28_4_ = uVar189;
    bVar106 = (byte)uVar77 & (byte)uVar78 & bVar98;
    auVar114 = vblendmps_avx512vl(auVar126,auVar131);
    auVar135._0_4_ =
         (uint)(bVar106 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar106 & 1) * auVar134._0_4_;
    bVar14 = (bool)(bVar106 >> 1 & 1);
    auVar135._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * auVar134._4_4_;
    bVar14 = (bool)(bVar106 >> 2 & 1);
    auVar135._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * auVar134._8_4_;
    bVar14 = (bool)(bVar106 >> 3 & 1);
    auVar135._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * auVar134._12_4_;
    bVar14 = (bool)(bVar106 >> 4 & 1);
    auVar135._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * auVar134._16_4_;
    bVar14 = (bool)(bVar106 >> 5 & 1);
    auVar135._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * auVar134._20_4_;
    bVar14 = (bool)(bVar106 >> 6 & 1);
    auVar135._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * auVar134._24_4_;
    auVar135._28_4_ =
         (uint)(bVar106 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar106 >> 7) * auVar134._28_4_;
    auVar192 = ZEXT3264(auVar135);
    bVar106 = (byte)uVar79 & (byte)uVar80 & bVar98;
    auVar114 = vblendmps_avx512vl(auVar187,auVar132);
    auVar136._0_4_ =
         (uint)(bVar106 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar106 & 1) * (int)auVar168._0_4_;
    bVar14 = (bool)(bVar106 >> 1 & 1);
    auVar136._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * (int)auVar168._4_4_;
    bVar14 = (bool)(bVar106 >> 2 & 1);
    auVar136._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * (int)auVar168._8_4_;
    bVar14 = (bool)(bVar106 >> 3 & 1);
    auVar136._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * (int)auVar168._12_4_;
    bVar14 = (bool)(bVar106 >> 4 & 1);
    auVar136._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * (int)auVar168._16_4_;
    bVar14 = (bool)(bVar106 >> 5 & 1);
    auVar136._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * (int)auVar168._20_4_;
    bVar14 = (bool)(bVar106 >> 6 & 1);
    auVar136._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * (int)auVar168._24_4_;
    auVar136._28_4_ =
         (uint)(bVar106 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar106 >> 7) * auVar168._28_4_;
    auVar193 = ZEXT3264(auVar136);
    auVar172._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
    auVar172._8_4_ = auVar121._8_4_ ^ 0x80000000;
    auVar172._12_4_ = auVar121._12_4_ ^ 0x80000000;
    auVar172._16_4_ = auVar121._16_4_ ^ 0x80000000;
    auVar172._20_4_ = auVar121._20_4_ ^ 0x80000000;
    auVar172._24_4_ = auVar121._24_4_ ^ 0x80000000;
    auVar172._28_4_ = auVar121._28_4_ ^ 0x80000000;
    uVar104 = vcmpps_avx512vl(ZEXT1632(auVar110),auVar87,1);
    uVar104 = (bVar98 & ~(byte)line->rightExists) & uVar104;
    auVar114 = vmulps_avx512vl(auVar124,auVar172);
    bVar14 = (bool)((byte)uVar104 & 1);
    auVar137._0_4_ = (uint)bVar14 * auVar114._0_4_ | (uint)!bVar14 * iVar109;
    bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
    auVar137._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * iVar145;
    bVar14 = (bool)((byte)(uVar104 >> 2) & 1);
    auVar137._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * iVar146;
    bVar14 = (bool)((byte)(uVar104 >> 3) & 1);
    auVar137._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * iVar147;
    bVar14 = (bool)((byte)(uVar104 >> 4) & 1);
    auVar137._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * iVar148;
    bVar14 = (bool)((byte)(uVar104 >> 5) & 1);
    auVar137._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * iVar149;
    bVar14 = (bool)((byte)(uVar104 >> 6) & 1);
    auVar137._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * iVar150;
    bVar14 = SUB81(uVar104 >> 7,0);
    auVar137._28_4_ = (uint)bVar14 * auVar114._28_4_ | (uint)!bVar14 * iVar151;
    auVar115 = vminps_avx512vl(auVar133,auVar137);
    auVar123 = vmaxps_avx512vl(auVar133,auVar137);
    auVar114 = vminps_avx(auVar135,auVar115);
    uVar104 = vcmpps_avx512vl(auVar114,auVar115,0);
    uVar105 = vcmpps_avx512vl(auVar123,auVar126,0);
    bVar14 = (bool)((byte)uVar105 & 1);
    bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
    bVar19 = (bool)((byte)(uVar105 >> 2) & 1);
    bVar21 = (bool)((byte)(uVar105 >> 3) & 1);
    bVar27 = (bool)((byte)(uVar105 >> 4) & 1);
    bVar36 = (bool)((byte)(uVar105 >> 5) & 1);
    bVar45 = (bool)((byte)(uVar105 >> 6) & 1);
    bVar54 = SUB81(uVar105 >> 7,0);
    uVar105 = vcmpps_avx512vl(auVar115,auVar126,0);
    bVar15 = (bool)((byte)uVar105 & 1);
    bVar18 = (bool)((byte)(uVar105 >> 1) & 1);
    bVar20 = (bool)((byte)(uVar105 >> 2) & 1);
    bVar22 = (bool)((byte)(uVar105 >> 3) & 1);
    bVar28 = (bool)((byte)(uVar105 >> 4) & 1);
    bVar37 = (bool)((byte)(uVar105 >> 5) & 1);
    bVar46 = (bool)((byte)(uVar105 >> 6) & 1);
    bVar55 = SUB81(uVar105 >> 7,0);
    bVar16 = (bool)((byte)uVar104 & 1);
    auVar138._0_4_ =
         (uint)bVar16 * ((uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar123._0_4_) |
         (uint)!bVar16 * ((uint)bVar15 * -0x800000 | (uint)!bVar15 * auVar115._0_4_);
    bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
    auVar138._4_4_ =
         (uint)bVar14 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar123._4_4_) |
         (uint)!bVar14 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar115._4_4_);
    bVar14 = (bool)((byte)(uVar104 >> 2) & 1);
    auVar138._8_4_ =
         (uint)bVar14 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar123._8_4_) |
         (uint)!bVar14 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar115._8_4_);
    bVar14 = (bool)((byte)(uVar104 >> 3) & 1);
    auVar138._12_4_ =
         (uint)bVar14 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar123._12_4_) |
         (uint)!bVar14 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar115._12_4_);
    bVar14 = (bool)((byte)(uVar104 >> 4) & 1);
    auVar138._16_4_ =
         (uint)bVar14 * ((uint)bVar27 * -0x800000 | (uint)!bVar27 * auVar123._16_4_) |
         (uint)!bVar14 * ((uint)bVar28 * -0x800000 | (uint)!bVar28 * auVar115._16_4_);
    bVar14 = (bool)((byte)(uVar104 >> 5) & 1);
    auVar138._20_4_ =
         (uint)bVar14 * ((uint)bVar36 * -0x800000 | (uint)!bVar36 * auVar123._20_4_) |
         (uint)!bVar14 * ((uint)bVar37 * -0x800000 | (uint)!bVar37 * auVar115._20_4_);
    bVar14 = (bool)((byte)(uVar104 >> 6) & 1);
    auVar138._24_4_ =
         (uint)bVar14 * ((uint)bVar45 * -0x800000 | (uint)!bVar45 * auVar123._24_4_) |
         (uint)!bVar14 * ((uint)bVar46 * -0x800000 | (uint)!bVar46 * auVar115._24_4_);
    bVar14 = SUB81(uVar104 >> 7,0);
    auVar138._28_4_ =
         (uint)bVar14 * ((uint)bVar54 * -0x800000 | (uint)!bVar54 * auVar123._28_4_) |
         (uint)!bVar14 * ((uint)bVar55 * -0x800000 | (uint)!bVar55 * auVar115._28_4_);
    auVar115 = vmaxps_avx512vl(auVar136,auVar138);
    auVar194 = ZEXT3264(auVar115);
    auVar169._0_4_ = auVar152._0_4_ + auVar114._0_4_;
    auVar169._4_4_ = auVar152._4_4_ + auVar114._4_4_;
    auVar169._8_4_ = auVar152._8_4_ + auVar114._8_4_;
    auVar169._12_4_ = auVar152._12_4_ + auVar114._12_4_;
    auVar169._16_4_ = auVar152._16_4_ + auVar114._16_4_;
    auVar169._20_4_ = auVar152._20_4_ + auVar114._20_4_;
    auVar169._24_4_ = auVar152._24_4_ + auVar114._24_4_;
    auVar169._28_4_ = auVar114._28_4_ + 0.0;
    uVar104 = vcmpps_avx512vl(auVar174,auVar169,2);
    uVar189 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar190._4_4_ = uVar189;
    auVar190._0_4_ = uVar189;
    auVar190._8_4_ = uVar189;
    auVar190._12_4_ = uVar189;
    auVar190._16_4_ = uVar189;
    auVar190._20_4_ = uVar189;
    auVar190._24_4_ = uVar189;
    auVar190._28_4_ = uVar189;
    auVar191 = ZEXT3264(auVar190);
    uVar105 = vcmpps_avx512vl(auVar169,auVar190,2);
    auVar123 = vaddps_avx512vl(auVar152,auVar115);
    auVar178 = ZEXT3264(auVar123);
    uVar77 = vcmpps_avx512vl(auVar174,auVar123,2);
    uVar78 = vcmpps_avx512vl(auVar123,auVar190,2);
    uVar79 = vcmpps_avx512vl(auVar115,auVar187,4);
    bVar103 = (byte)uVar77 & (byte)uVar78 & (byte)uVar79;
    uVar107 = vcmpps_avx512vl(auVar114,auVar126,4);
    uVar107 = uVar104 & uVar105 & uVar107;
    bVar106 = (byte)uVar107 & bVar98;
    bVar97 = bVar98 & ((byte)uVar107 | bVar103);
    uVar104 = (ulong)bVar97;
    if (bVar97 != 0) {
      auVar115 = vblendmps_avx512vl(auVar115,auVar114);
      auVar139._0_4_ =
           (float)((uint)(bVar106 & 1) * auVar115._0_4_ |
                  (uint)!(bool)(bVar106 & 1) * (int)auVar169._0_4_);
      bVar14 = (bool)(bVar106 >> 1 & 1);
      auVar139._4_4_ = (float)((uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * (int)auVar169._4_4_);
      bVar14 = (bool)(bVar106 >> 2 & 1);
      auVar139._8_4_ = (float)((uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * (int)auVar169._8_4_);
      bVar14 = (bool)(bVar106 >> 3 & 1);
      auVar139._12_4_ =
           (float)((uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * (int)auVar169._12_4_);
      bVar14 = (bool)(bVar106 >> 4 & 1);
      auVar139._16_4_ =
           (float)((uint)bVar14 * auVar115._16_4_ | (uint)!bVar14 * (int)auVar169._16_4_);
      bVar14 = (bool)(bVar106 >> 5 & 1);
      auVar139._20_4_ =
           (float)((uint)bVar14 * auVar115._20_4_ | (uint)!bVar14 * (int)auVar169._20_4_);
      bVar14 = (bool)(bVar106 >> 6 & 1);
      auVar139._24_4_ =
           (float)((uint)bVar14 * auVar115._24_4_ | (uint)!bVar14 * (int)auVar169._24_4_);
      auVar139._28_4_ =
           (float)((uint)(bVar106 >> 7) * auVar115._28_4_ |
                  (uint)!(bool)(bVar106 >> 7) * (int)auVar169._28_4_);
      auVar115 = vblendmps_avx512vl(auVar127,auVar185);
      auVar140._0_4_ =
           (float)((uint)(bVar106 & 1) * auVar115._0_4_ |
                  (uint)!(bool)(bVar106 & 1) * (int)auVar114._0_4_);
      bVar14 = (bool)(bVar106 >> 1 & 1);
      auVar140._4_4_ = (float)((uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * (int)auVar114._4_4_);
      bVar14 = (bool)(bVar106 >> 2 & 1);
      auVar140._8_4_ = (float)((uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * (int)auVar114._8_4_);
      bVar14 = (bool)(bVar106 >> 3 & 1);
      auVar140._12_4_ =
           (float)((uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * (int)auVar114._12_4_);
      bVar14 = (bool)(bVar106 >> 4 & 1);
      auVar140._16_4_ =
           (float)((uint)bVar14 * auVar115._16_4_ | (uint)!bVar14 * (int)auVar114._16_4_);
      bVar14 = (bool)(bVar106 >> 5 & 1);
      auVar140._20_4_ =
           (float)((uint)bVar14 * auVar115._20_4_ | (uint)!bVar14 * (int)auVar114._20_4_);
      bVar14 = (bool)(bVar106 >> 6 & 1);
      auVar140._24_4_ =
           (float)((uint)bVar14 * auVar115._24_4_ | (uint)!bVar14 * (int)auVar114._24_4_);
      auVar140._28_4_ =
           (uint)(bVar106 >> 7) * auVar115._28_4_ |
           (uint)!(bool)(bVar106 >> 7) * (int)auVar114._28_4_;
      auVar114 = vrcp14ps_avx512vl(auVar120);
      auVar115 = vfnmadd213ps_avx512vl(auVar114,auVar120,auVar129);
      auVar110 = vfmadd132ps_fma(auVar115,auVar114,auVar114);
      auVar186 = ZEXT1664(auVar110);
      auVar88._4_4_ = fVar61 * fVar3 * auVar120._4_4_;
      auVar88._0_4_ = fVar59 * fVar1 * auVar120._0_4_;
      auVar88._8_4_ = fVar64 * fVar62 * auVar120._8_4_;
      auVar88._12_4_ = fVar67 * fVar65 * auVar120._12_4_;
      auVar88._16_4_ = fVar70 * fVar68 * auVar120._16_4_;
      auVar88._20_4_ = fVar73 * fVar71 * auVar120._20_4_;
      auVar88._24_4_ = fVar76 * fVar74 * auVar120._24_4_;
      auVar88._28_4_ = auVar141._28_4_;
      _local_2e0 = vmulps_avx512vl(auVar116,auVar88);
      auVar114 = vmulps_avx512vl(auVar117,auVar88);
      auVar195 = ZEXT3264(auVar114);
      auVar115 = vmulps_avx512vl(auVar116,auVar158);
      auVar196 = ZEXT3264(auVar115);
      auVar123 = vmulps_avx512vl(auVar117,auVar158);
      auVar207 = ZEXT3264(auVar123);
      uVar77 = vcmpps_avx512vl(auVar139,auVar135,0);
      uVar78 = vcmpps_avx512vl(auVar139,auVar136,0);
      bVar81 = ((byte)uVar77 | (byte)uVar78) & bVar98;
      uVar105 = vcmpps_avx512vl(auVar139,auVar133,0);
      uVar105 = uVar96 & uVar108 & uVar105;
      auVar141 = vmulps_avx512vl(auVar111,auVar139);
      auVar160._0_4_ = auVar141._0_4_ + (float)local_7e0._0_4_;
      auVar160._4_4_ = auVar141._4_4_ + (float)local_7e0._4_4_;
      auVar160._8_4_ = auVar141._8_4_ + fStack_7d8;
      auVar160._12_4_ = auVar141._12_4_ + fStack_7d4;
      auVar160._16_4_ = auVar141._16_4_ + fStack_7d0;
      auVar160._20_4_ = auVar141._20_4_ + fStack_7cc;
      auVar160._24_4_ = auVar141._24_4_ + fStack_7c8;
      auVar160._28_4_ = auVar141._28_4_ + fStack_7c4;
      auVar141 = vmulps_avx512vl(auVar125,auVar160);
      auVar161._0_4_ = local_2e0._0_4_ + auVar141._0_4_;
      auVar161._4_4_ = local_2e0._4_4_ + auVar141._4_4_;
      auVar161._8_4_ = local_2e0._8_4_ + auVar141._8_4_;
      auVar161._12_4_ = local_2e0._12_4_ + auVar141._12_4_;
      auVar161._16_4_ = local_2e0._16_4_ + auVar141._16_4_;
      auVar161._20_4_ = local_2e0._20_4_ + auVar141._20_4_;
      auVar161._24_4_ = local_2e0._24_4_ + auVar141._24_4_;
      auVar161._28_4_ = local_2e0._28_4_ + auVar141._28_4_;
      auVar115 = vmulps_avx512vl(auVar115,auVar140);
      local_300 = vxorps_avx512vl(auVar116,auVar165);
      auVar116 = vblendmps_avx512vl(auVar116,local_300);
      bVar106 = (byte)uVar105;
      bVar14 = (bool)((byte)(uVar105 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar105 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar105 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar105 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar105 >> 6) & 1);
      bVar21 = SUB81(uVar105 >> 7,0);
      auVar115 = vsubps_avx512vl(auVar161,auVar115);
      local_6e0._0_4_ =
           (uint)(bVar81 & 1) * auVar115._0_4_ |
           (uint)!(bool)(bVar81 & 1) *
           ((uint)(bVar106 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar106 & 1) * local_300._0_4_);
      bVar15 = (bool)(bVar81 >> 1 & 1);
      local_6e0._4_4_ =
           (uint)bVar15 * auVar115._4_4_ |
           (uint)!bVar15 * ((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_300._4_4_);
      bVar14 = (bool)(bVar81 >> 2 & 1);
      local_6e0._8_4_ =
           (uint)bVar14 * auVar115._8_4_ |
           (uint)!bVar14 * ((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * local_300._8_4_);
      bVar14 = (bool)(bVar81 >> 3 & 1);
      local_6e0._12_4_ =
           (uint)bVar14 * auVar115._12_4_ |
           (uint)!bVar14 * ((uint)bVar17 * auVar116._12_4_ | (uint)!bVar17 * local_300._12_4_);
      bVar14 = (bool)(bVar81 >> 4 & 1);
      local_6e0._16_4_ =
           (uint)bVar14 * auVar115._16_4_ |
           (uint)!bVar14 * ((uint)bVar18 * auVar116._16_4_ | (uint)!bVar18 * local_300._16_4_);
      bVar14 = (bool)(bVar81 >> 5 & 1);
      local_6e0._20_4_ =
           (uint)bVar14 * auVar115._20_4_ |
           (uint)!bVar14 * ((uint)bVar19 * auVar116._20_4_ | (uint)!bVar19 * local_300._20_4_);
      bVar14 = (bool)(bVar81 >> 6 & 1);
      local_6e0._24_4_ =
           (uint)bVar14 * auVar115._24_4_ |
           (uint)!bVar14 * ((uint)bVar20 * auVar116._24_4_ | (uint)!bVar20 * local_300._24_4_);
      local_6e0._28_4_ =
           (uint)(bVar81 >> 7) * auVar115._28_4_ |
           (uint)!(bool)(bVar81 >> 7) *
           ((uint)bVar21 * auVar116._28_4_ | (uint)!bVar21 * local_300._28_4_);
      auVar173 = ZEXT3264(local_6e0);
      auVar115 = vmulps_avx512vl(auVar112,auVar139);
      auVar162._0_4_ = auVar115._0_4_ + (float)local_7a0._0_4_;
      auVar162._4_4_ = auVar115._4_4_ + (float)local_7a0._4_4_;
      auVar162._8_4_ = auVar115._8_4_ + fStack_798;
      auVar162._12_4_ = auVar115._12_4_ + fStack_794;
      auVar162._16_4_ = auVar115._16_4_ + fStack_790;
      auVar162._20_4_ = auVar115._20_4_ + fStack_78c;
      auVar162._24_4_ = auVar115._24_4_ + fStack_788;
      auVar162._28_4_ = auVar115._28_4_ + local_7a0._28_4_;
      auVar115 = vmulps_avx512vl(auVar125,auVar162);
      auVar114 = vaddps_avx512vl(auVar114,auVar115);
      iVar145 = (uint)!(bool)(bVar106 & 1) * auVar129._0_4_;
      iVar109 = (uint)!(bool)((byte)(uVar105 >> 1) & 1) * auVar129._4_4_;
      iVar146 = (uint)!(bool)((byte)(uVar105 >> 2) & 1) * auVar129._8_4_;
      iVar147 = (uint)!(bool)((byte)(uVar105 >> 3) & 1) * auVar129._12_4_;
      iVar148 = (uint)!(bool)((byte)(uVar105 >> 4) & 1) * auVar129._16_4_;
      iVar149 = (uint)!(bool)((byte)(uVar105 >> 5) & 1) * auVar129._20_4_;
      iVar150 = (uint)!(bool)((byte)(uVar105 >> 6) & 1) * auVar129._24_4_;
      iVar151 = (uint)!SUB81(uVar105 >> 7,0) * auVar129._28_4_;
      auVar197 = ZEXT3264(CONCAT428(iVar151,CONCAT424(iVar150,CONCAT420(iVar149,CONCAT416(iVar148,
                                                  CONCAT412(iVar147,CONCAT48(iVar146,CONCAT44(
                                                  iVar109,iVar145))))))));
      auVar115 = vmulps_avx512vl(auVar140,ZEXT1632(auVar110));
      bVar14 = (bool)(bVar81 >> 1 & 1);
      bVar15 = (bool)(bVar81 >> 2 & 1);
      bVar16 = (bool)(bVar81 >> 3 & 1);
      bVar17 = (bool)(bVar81 >> 4 & 1);
      bVar18 = (bool)(bVar81 >> 5 & 1);
      bVar19 = (bool)(bVar81 >> 6 & 1);
      local_740[0] = (uint)(bVar81 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar81 & 1) * iVar145;
      local_740[1] = (uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * iVar109;
      local_740[2] = (uint)bVar15 * auVar115._8_4_ | (uint)!bVar15 * iVar146;
      local_740[3] = (uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * iVar147;
      uStack_730 = (uint)bVar17 * auVar115._16_4_ | (uint)!bVar17 * iVar148;
      uStack_72c = (uint)bVar18 * auVar115._20_4_ | (uint)!bVar18 * iVar149;
      uStack_728 = (uint)bVar19 * auVar115._24_4_ | (uint)!bVar19 * iVar150;
      uStack_724 = (uint)(bVar81 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar81 >> 7) * iVar151;
      auVar115 = vmulps_avx512vl(auVar123,auVar140);
      local_720 = ZEXT432(0) << 0x20;
      auVar116 = vxorps_avx512vl(auVar117,auVar165);
      auVar175 = ZEXT3264(auVar116);
      local_700._0_4_ = auVar152._0_4_ + auVar139._0_4_;
      local_700._4_4_ = auVar152._4_4_ + auVar139._4_4_;
      local_700._8_4_ = auVar152._8_4_ + auVar139._8_4_;
      local_700._12_4_ = auVar152._12_4_ + auVar139._12_4_;
      local_700._16_4_ = auVar152._16_4_ + auVar139._16_4_;
      local_700._20_4_ = auVar152._20_4_ + auVar139._20_4_;
      local_700._24_4_ = auVar152._24_4_ + auVar139._24_4_;
      local_700._28_4_ = auVar139._28_4_ + 0.0;
      auVar116 = vblendmps_avx512vl(auVar117,auVar116);
      bVar14 = (bool)((byte)(uVar105 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar105 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar105 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar105 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar105 >> 6) & 1);
      auVar114 = vsubps_avx512vl(auVar114,auVar115);
      local_6c0[0] = (uint)(bVar81 & 1) * auVar114._0_4_ |
                     (uint)!(bool)(bVar81 & 1) *
                     ((uint)(bVar106 & 1) * auVar116._0_4_ |
                     (uint)!(bool)(bVar106 & 1) * (int)auVar152._0_4_);
      bVar15 = (bool)(bVar81 >> 1 & 1);
      local_6c0[1] = (uint)bVar15 * auVar114._4_4_ |
                     (uint)!bVar15 *
                     ((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * (int)auVar152._4_4_);
      bVar14 = (bool)(bVar81 >> 2 & 1);
      local_6c0[2] = (uint)bVar14 * auVar114._8_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * (int)auVar152._8_4_);
      bVar14 = (bool)(bVar81 >> 3 & 1);
      local_6c0[3] = (uint)bVar14 * auVar114._12_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar17 * auVar116._12_4_ | (uint)!bVar17 * (int)auVar152._12_4_);
      bVar14 = (bool)(bVar81 >> 4 & 1);
      uStack_6b0 = (uint)bVar14 * auVar114._16_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar18 * auVar116._16_4_ | (uint)!bVar18 * (int)auVar152._16_4_);
      bVar14 = (bool)(bVar81 >> 5 & 1);
      uStack_6ac = (uint)bVar14 * auVar114._20_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar19 * auVar116._20_4_ | (uint)!bVar19 * (int)auVar152._20_4_);
      bVar14 = (bool)(bVar81 >> 6 & 1);
      uStack_6a8 = (uint)bVar14 * auVar114._24_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar20 * auVar116._24_4_ | (uint)!bVar20 * (int)auVar152._24_4_);
      uStack_6a4 = (uint)(bVar81 >> 7) * auVar114._28_4_ |
                   (uint)!(bool)(bVar81 >> 7) * (uint)(byte)(uVar105 >> 7) * auVar116._28_4_;
      _local_340 = vmulps_avx512vl(auVar118,auVar88);
      auVar114 = vmulps_avx512vl(auVar118,auVar158);
      auVar167 = ZEXT3264(auVar114);
      auVar115 = vmulps_avx512vl(auVar113,auVar139);
      auVar115 = vaddps_avx512vl(auVar119,auVar115);
      auVar115 = vmulps_avx512vl(auVar125,auVar115);
      auVar113._0_4_ = local_340._0_4_ + auVar115._0_4_;
      auVar113._4_4_ = local_340._4_4_ + auVar115._4_4_;
      auVar113._8_4_ = local_340._8_4_ + auVar115._8_4_;
      auVar113._12_4_ = local_340._12_4_ + auVar115._12_4_;
      auVar113._16_4_ = local_340._16_4_ + auVar115._16_4_;
      auVar113._20_4_ = local_340._20_4_ + auVar115._20_4_;
      auVar113._24_4_ = local_340._24_4_ + auVar115._24_4_;
      auVar113._28_4_ = local_340._28_4_ + auVar115._28_4_;
      auVar111._4_4_ = auVar114._4_4_ * auVar140._4_4_;
      auVar111._0_4_ = auVar114._0_4_ * auVar140._0_4_;
      auVar111._8_4_ = auVar114._8_4_ * auVar140._8_4_;
      auVar111._12_4_ = auVar114._12_4_ * auVar140._12_4_;
      auVar111._16_4_ = auVar114._16_4_ * auVar140._16_4_;
      auVar111._20_4_ = auVar114._20_4_ * auVar140._20_4_;
      auVar111._24_4_ = auVar114._24_4_ * auVar140._24_4_;
      auVar111._28_4_ = auVar158._28_4_;
      local_320 = vxorps_avx512vl(auVar118,auVar165);
      auVar114 = vblendmps_avx512vl(auVar118,local_320);
      bVar14 = (bool)((byte)(uVar105 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar105 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar105 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar105 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar105 >> 6) & 1);
      bVar21 = SUB81(uVar105 >> 7,0);
      auVar163 = ZEXT3264(local_700);
      auVar115 = vsubps_avx512vl(auVar113,auVar111);
      local_6a0[0] = (uint)(bVar81 & 1) * auVar115._0_4_ |
                     (uint)!(bool)(bVar81 & 1) *
                     ((uint)(bVar106 & 1) * auVar114._0_4_ | !(bool)(bVar106 & 1) * local_6c0[0]);
      bVar15 = (bool)(bVar81 >> 1 & 1);
      local_6a0[1] = (uint)bVar15 * auVar115._4_4_ |
                     (uint)!bVar15 * ((uint)bVar14 * auVar114._4_4_ | !bVar14 * local_6c0[1]);
      bVar14 = (bool)(bVar81 >> 2 & 1);
      local_6a0[2] = (uint)bVar14 * auVar115._8_4_ |
                     (uint)!bVar14 * ((uint)bVar16 * auVar114._8_4_ | !bVar16 * local_6c0[2]);
      bVar14 = (bool)(bVar81 >> 3 & 1);
      local_6a0[3] = (uint)bVar14 * auVar115._12_4_ |
                     (uint)!bVar14 * ((uint)bVar17 * auVar114._12_4_ | !bVar17 * local_6c0[3]);
      bVar14 = (bool)(bVar81 >> 4 & 1);
      uStack_690 = (uint)bVar14 * auVar115._16_4_ |
                   (uint)!bVar14 * ((uint)bVar18 * auVar114._16_4_ | !bVar18 * uStack_6b0);
      bVar14 = (bool)(bVar81 >> 5 & 1);
      uStack_68c = (uint)bVar14 * auVar115._20_4_ |
                   (uint)!bVar14 * ((uint)bVar19 * auVar114._20_4_ | !bVar19 * uStack_6ac);
      bVar14 = (bool)(bVar81 >> 6 & 1);
      uStack_688 = (uint)bVar14 * auVar115._24_4_ |
                   (uint)!bVar14 * ((uint)bVar20 * auVar114._24_4_ | !bVar20 * uStack_6a8);
      uStack_684 = (uint)(bVar81 >> 7) * auVar115._28_4_ |
                   (uint)!(bool)(bVar81 >> 7) *
                   ((uint)bVar21 * auVar114._28_4_ | !bVar21 * uStack_6a4);
      auVar114 = vblendmps_avx512vl(auVar126,local_700);
      auVar112._0_4_ = (uint)(bVar97 & 1) * auVar114._0_4_ | !(bool)(bVar97 & 1) * local_6a0[0];
      bVar14 = (bool)(bVar97 >> 1 & 1);
      auVar112._4_4_ = (uint)bVar14 * auVar114._4_4_ | !bVar14 * local_6a0[1];
      bVar14 = (bool)(bVar97 >> 2 & 1);
      auVar112._8_4_ = (uint)bVar14 * auVar114._8_4_ | !bVar14 * local_6a0[2];
      bVar14 = (bool)(bVar97 >> 3 & 1);
      auVar112._12_4_ = (uint)bVar14 * auVar114._12_4_ | !bVar14 * local_6a0[3];
      bVar14 = (bool)(bVar97 >> 4 & 1);
      auVar112._16_4_ = (uint)bVar14 * auVar114._16_4_ | !bVar14 * uStack_690;
      bVar14 = (bool)(bVar97 >> 5 & 1);
      auVar112._20_4_ = (uint)bVar14 * auVar114._20_4_ | !bVar14 * uStack_68c;
      bVar14 = (bool)(bVar97 >> 6 & 1);
      auVar112._24_4_ = (uint)bVar14 * auVar114._24_4_ | !bVar14 * uStack_688;
      auVar112._28_4_ = (uint)(bVar97 >> 7) * auVar114._28_4_ | !(bool)(bVar97 >> 7) * uStack_684;
      auVar114 = vshufps_avx(auVar112,auVar112,0xb1);
      auVar114 = vminps_avx(auVar112,auVar114);
      auVar115 = vshufpd_avx(auVar114,auVar114,5);
      auVar114 = vminps_avx(auVar114,auVar115);
      auVar115 = vpermpd_avx2(auVar114,0x4e);
      auVar114 = vminps_avx(auVar114,auVar115);
      uVar77 = vcmpps_avx512vl(auVar112,auVar114,0);
      if (((byte)uVar77 & bVar97) != 0) {
        bVar97 = (byte)uVar77 & bVar97;
      }
      uVar99 = 0;
      for (uVar100 = (uint)bVar97; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
        uVar99 = uVar99 + 1;
      }
      auVar170 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar114 = vpcmpeqd_avx2(local_700,local_700);
      auVar188 = ZEXT3264(auVar114);
      local_7a8 = context;
LAB_01985dc9:
      bVar106 = (byte)uVar107;
      local_810.hit = local_2c0;
      auVar115 = auVar173._0_32_;
      auVar166 = auVar197._0_32_;
      auVar123 = auVar186._0_32_;
      auVar122 = auVar205._0_32_;
      auVar121 = auVar204._0_32_;
      auVar116 = auVar175._0_32_;
      auVar118 = auVar203._0_32_;
      auVar114 = auVar167._0_32_;
      auVar125 = auVar207._0_32_;
      auVar124 = auVar206._0_32_;
      auVar164 = auVar196._0_32_;
      auVar134 = auVar195._0_32_;
      auVar127 = auVar209._0_32_;
      auVar126 = auVar208._0_32_;
      auVar117 = auVar202._0_32_;
      auVar113 = auVar201._0_32_;
      auVar111 = auVar200._0_32_;
      auVar168 = auVar198._0_32_;
      auVar119 = auVar193._0_32_;
      auVar120 = auVar194._0_32_;
      auVar141 = auVar192._0_32_;
      uVar102 = uVar99 & 0xff;
      uVar100 = *(uint *)(local_360 + (ulong)uVar102 * 4);
      pGVar11 = (pSVar10->geometries).items[uVar100].ptr;
      local_810.ray = (RTCRayN *)ray;
      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
        uVar104 = (ulong)(byte)(~(byte)(1 << (uVar99 & 0x1f)) & (byte)uVar104);
        auVar153 = auVar112;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar108 = (ulong)(uVar102 << 2);
          uVar189 = *(undefined4 *)((long)local_740 + uVar108);
          uVar4 = *(undefined4 *)(local_720 + uVar108);
          auVar191 = ZEXT464(*(uint *)(local_700 + uVar108));
          *(uint *)(ray + k * 4 + 0x200) = *(uint *)(local_700 + uVar108);
          *(undefined4 *)(ray + k * 4 + 0x300) = *(undefined4 *)(local_6e0 + uVar108);
          *(undefined4 *)(ray + k * 4 + 0x340) = *(undefined4 *)((long)local_6c0 + uVar108);
          *(undefined4 *)(ray + k * 4 + 0x380) = *(undefined4 *)((long)local_6a0 + uVar108);
          *(undefined4 *)(ray + k * 4 + 0x3c0) = uVar189;
          *(undefined4 *)(ray + k * 4 + 0x400) = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x440) =
               *(undefined4 *)((long)&(line->primIDs).field_0 + uVar108);
          *(uint *)(ray + k * 4 + 0x480) = uVar100;
          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
LAB_0198643a:
          uVar189 = auVar191._0_4_;
          auVar154._4_4_ = uVar189;
          auVar154._0_4_ = uVar189;
          auVar154._8_4_ = uVar189;
          auVar154._12_4_ = uVar189;
          auVar154._16_4_ = uVar189;
          auVar154._20_4_ = uVar189;
          auVar154._24_4_ = uVar189;
          auVar154._28_4_ = uVar189;
          local_700 = auVar178._0_32_;
          uVar77 = vcmpps_avx512vl(local_700,auVar154,2);
          bVar98 = bVar106 & (byte)uVar77 & bVar103 & bVar98;
          uVar108 = (ulong)bVar98;
          if (bVar98 == 0) {
            return;
          }
          uVar77 = vcmpps_avx512vl(auVar120,auVar141,0);
          uVar78 = vcmpps_avx512vl(auVar120,auVar119,0);
          bVar97 = (byte)uVar77 | (byte)uVar78;
          uVar96 = vcmpps_avx512vl(auVar120,auVar168,0);
          auVar141 = vmulps_avx512vl(auVar111,auVar120);
          auVar119 = vmulps_avx512vl(auVar113,auVar120);
          auVar120 = vmulps_avx512vl(auVar117,auVar120);
          auVar155._0_4_ = auVar141._0_4_ + (float)local_7e0._0_4_;
          auVar155._4_4_ = auVar141._4_4_ + (float)local_7e0._4_4_;
          auVar155._8_4_ = auVar141._8_4_ + fStack_7d8;
          auVar155._12_4_ = auVar141._12_4_ + fStack_7d4;
          auVar155._16_4_ = auVar141._16_4_ + fStack_7d0;
          auVar155._20_4_ = auVar141._20_4_ + fStack_7cc;
          auVar155._24_4_ = auVar141._24_4_ + fStack_7c8;
          auVar155._28_4_ = auVar141._28_4_ + fStack_7c4;
          auVar157._0_4_ = auVar119._0_4_ + (float)local_7a0._0_4_;
          auVar157._4_4_ = auVar119._4_4_ + (float)local_7a0._4_4_;
          auVar157._8_4_ = auVar119._8_4_ + fStack_798;
          auVar157._12_4_ = auVar119._12_4_ + fStack_794;
          auVar157._16_4_ = auVar119._16_4_ + fStack_790;
          auVar157._20_4_ = auVar119._20_4_ + fStack_78c;
          auVar157._24_4_ = auVar119._24_4_ + fStack_788;
          auVar157._28_4_ = auVar119._28_4_ + fStack_784;
          auVar141 = vaddps_avx512vl(auVar126,auVar120);
          auVar119 = vmulps_avx512vl(auVar127,auVar155);
          auVar120 = vmulps_avx512vl(auVar127,auVar157);
          auVar141 = vmulps_avx512vl(auVar127,auVar141);
          auVar156._0_4_ = auVar119._0_4_ + (float)local_2e0._0_4_;
          auVar156._4_4_ = auVar119._4_4_ + (float)local_2e0._4_4_;
          auVar156._8_4_ = auVar119._8_4_ + fStack_2d8;
          auVar156._12_4_ = auVar119._12_4_ + fStack_2d4;
          auVar156._16_4_ = auVar119._16_4_ + fStack_2d0;
          auVar156._20_4_ = auVar119._20_4_ + fStack_2cc;
          auVar156._24_4_ = auVar119._24_4_ + fStack_2c8;
          auVar156._28_4_ = auVar119._28_4_ + fStack_2c4;
          auVar119 = vaddps_avx512vl(auVar134,auVar120);
          auVar159._0_4_ = auVar141._0_4_ + (float)local_340._0_4_;
          auVar159._4_4_ = auVar141._4_4_ + (float)local_340._4_4_;
          auVar159._8_4_ = auVar141._8_4_ + fStack_338;
          auVar159._12_4_ = auVar141._12_4_ + fStack_334;
          auVar159._16_4_ = auVar141._16_4_ + fStack_330;
          auVar159._20_4_ = auVar141._20_4_ + fStack_32c;
          auVar159._24_4_ = auVar141._24_4_ + fStack_328;
          auVar159._28_4_ = auVar141._28_4_ + fStack_324;
          auVar141 = vmulps_avx512vl(auVar164,auVar124);
          auVar120 = vmulps_avx512vl(auVar125,auVar124);
          auVar114 = vmulps_avx512vl(auVar114,auVar124);
          bVar106 = (byte)uVar96;
          bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar96 >> 2) & 1);
          bVar46 = (bool)((byte)(uVar96 >> 3) & 1);
          bVar29 = (bool)((byte)(uVar96 >> 4) & 1);
          bVar38 = (bool)((byte)(uVar96 >> 5) & 1);
          bVar47 = (bool)((byte)(uVar96 >> 6) & 1);
          bVar56 = SUB81(uVar96 >> 7,0);
          bVar15 = (bool)((byte)(uVar96 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar96 >> 2) & 1);
          bVar54 = (bool)((byte)(uVar96 >> 3) & 1);
          bVar30 = (bool)((byte)(uVar96 >> 4) & 1);
          bVar39 = (bool)((byte)(uVar96 >> 5) & 1);
          bVar48 = (bool)((byte)(uVar96 >> 6) & 1);
          bVar57 = SUB81(uVar96 >> 7,0);
          bVar16 = (bool)((byte)(uVar96 >> 1) & 1);
          bVar27 = (bool)((byte)(uVar96 >> 2) & 1);
          bVar55 = (bool)((byte)(uVar96 >> 3) & 1);
          bVar31 = (bool)((byte)(uVar96 >> 4) & 1);
          bVar40 = (bool)((byte)(uVar96 >> 5) & 1);
          bVar49 = (bool)((byte)(uVar96 >> 6) & 1);
          bVar58 = SUB81(uVar96 >> 7,0);
          auVar141 = vsubps_avx512vl(auVar156,auVar141);
          bVar17 = (bool)(bVar97 >> 1 & 1);
          bVar28 = (bool)(bVar97 >> 2 & 1);
          bVar23 = (bool)(bVar97 >> 3 & 1);
          bVar32 = (bool)(bVar97 >> 4 & 1);
          bVar41 = (bool)(bVar97 >> 5 & 1);
          bVar50 = (bool)(bVar97 >> 6 & 1);
          auVar119 = vsubps_avx512vl(auVar119,auVar120);
          bVar18 = (bool)(bVar97 >> 1 & 1);
          bVar36 = (bool)(bVar97 >> 2 & 1);
          bVar24 = (bool)(bVar97 >> 3 & 1);
          bVar33 = (bool)(bVar97 >> 4 & 1);
          bVar42 = (bool)(bVar97 >> 5 & 1);
          bVar51 = (bool)(bVar97 >> 6 & 1);
          auVar114 = vsubps_avx512vl(auVar159,auVar114);
          bVar19 = (bool)(bVar97 >> 1 & 1);
          bVar37 = (bool)(bVar97 >> 2 & 1);
          bVar25 = (bool)(bVar97 >> 3 & 1);
          bVar34 = (bool)(bVar97 >> 4 & 1);
          bVar43 = (bool)(bVar97 >> 5 & 1);
          bVar52 = (bool)(bVar97 >> 6 & 1);
          auVar123 = vmulps_avx512vl(auVar124,auVar123);
          bVar20 = (bool)(bVar97 >> 1 & 1);
          bVar45 = (bool)(bVar97 >> 2 & 1);
          bVar26 = (bool)(bVar97 >> 3 & 1);
          bVar35 = (bool)(bVar97 >> 4 & 1);
          bVar44 = (bool)(bVar97 >> 5 & 1);
          bVar53 = (bool)(bVar97 >> 6 & 1);
          local_740[0] = (uint)(bVar97 & 1) * auVar123._0_4_ |
                         (uint)!(bool)(bVar97 & 1) * auVar166._0_4_;
          local_740[1] = (uint)bVar20 * auVar123._4_4_ | (uint)!bVar20 * auVar166._4_4_;
          local_740[2] = (uint)bVar45 * auVar123._8_4_ | (uint)!bVar45 * auVar166._8_4_;
          local_740[3] = (uint)bVar26 * auVar123._12_4_ | (uint)!bVar26 * auVar166._12_4_;
          uStack_730 = (uint)bVar35 * auVar123._16_4_ | (uint)!bVar35 * auVar166._16_4_;
          uStack_72c = (uint)bVar44 * auVar123._20_4_ | (uint)!bVar44 * auVar166._20_4_;
          uStack_728 = (uint)bVar53 * auVar123._24_4_ | (uint)!bVar53 * auVar166._24_4_;
          uStack_724 = (uint)(bVar97 >> 7) * auVar123._28_4_ |
                       (uint)!(bool)(bVar97 >> 7) * auVar166._28_4_;
          local_720 = ZEXT432(0) << 0x20;
          local_6e0._4_4_ =
               (uint)bVar17 * auVar141._4_4_ |
               (uint)!bVar17 * ((uint)bVar14 * local_300._4_4_ | (uint)!bVar14 * auVar118._4_4_);
          local_6e0._0_4_ =
               (uint)(bVar97 & 1) * auVar141._0_4_ |
               (uint)!(bool)(bVar97 & 1) *
               ((uint)(bVar106 & 1) * local_300._0_4_ | (uint)!(bool)(bVar106 & 1) * auVar118._0_4_)
          ;
          local_6e0._8_4_ =
               (uint)bVar28 * auVar141._8_4_ |
               (uint)!bVar28 * ((uint)bVar21 * local_300._8_4_ | (uint)!bVar21 * auVar118._8_4_);
          local_6e0._12_4_ =
               (uint)bVar23 * auVar141._12_4_ |
               (uint)!bVar23 * ((uint)bVar46 * local_300._12_4_ | (uint)!bVar46 * auVar118._12_4_);
          local_6e0._16_4_ =
               (uint)bVar32 * auVar141._16_4_ |
               (uint)!bVar32 * ((uint)bVar29 * local_300._16_4_ | (uint)!bVar29 * auVar118._16_4_);
          local_6e0._20_4_ =
               (uint)bVar41 * auVar141._20_4_ |
               (uint)!bVar41 * ((uint)bVar38 * local_300._20_4_ | (uint)!bVar38 * auVar118._20_4_);
          local_6e0._24_4_ =
               (uint)bVar50 * auVar141._24_4_ |
               (uint)!bVar50 * ((uint)bVar47 * local_300._24_4_ | (uint)!bVar47 * auVar118._24_4_);
          local_6e0._28_4_ =
               (uint)(bVar97 >> 7) * auVar141._28_4_ |
               (uint)!(bool)(bVar97 >> 7) *
               ((uint)bVar56 * local_300._28_4_ | (uint)!bVar56 * auVar118._28_4_);
          local_6c0[0] = (uint)(bVar97 & 1) * auVar119._0_4_ |
                         (uint)!(bool)(bVar97 & 1) *
                         ((uint)(bVar106 & 1) * auVar116._0_4_ |
                         (uint)!(bool)(bVar106 & 1) * auVar121._0_4_);
          local_6c0[1] = (uint)bVar18 * auVar119._4_4_ |
                         (uint)!bVar18 *
                         ((uint)bVar15 * auVar116._4_4_ | (uint)!bVar15 * auVar121._4_4_);
          local_6c0[2] = (uint)bVar36 * auVar119._8_4_ |
                         (uint)!bVar36 *
                         ((uint)bVar22 * auVar116._8_4_ | (uint)!bVar22 * auVar121._8_4_);
          local_6c0[3] = (uint)bVar24 * auVar119._12_4_ |
                         (uint)!bVar24 *
                         ((uint)bVar54 * auVar116._12_4_ | (uint)!bVar54 * auVar121._12_4_);
          uStack_6b0 = (uint)bVar33 * auVar119._16_4_ |
                       (uint)!bVar33 *
                       ((uint)bVar30 * auVar116._16_4_ | (uint)!bVar30 * auVar121._16_4_);
          uStack_6ac = (uint)bVar42 * auVar119._20_4_ |
                       (uint)!bVar42 *
                       ((uint)bVar39 * auVar116._20_4_ | (uint)!bVar39 * auVar121._20_4_);
          uStack_6a8 = (uint)bVar51 * auVar119._24_4_ |
                       (uint)!bVar51 *
                       ((uint)bVar48 * auVar116._24_4_ | (uint)!bVar48 * auVar121._24_4_);
          uStack_6a4 = (uint)(bVar97 >> 7) * auVar119._28_4_ |
                       (uint)!(bool)(bVar97 >> 7) *
                       ((uint)bVar57 * auVar116._28_4_ | (uint)!bVar57 * auVar121._28_4_);
          local_6a0[0] = (uint)(bVar97 & 1) * auVar114._0_4_ |
                         (uint)!(bool)(bVar97 & 1) *
                         ((uint)(bVar106 & 1) * local_320._0_4_ |
                         (uint)!(bool)(bVar106 & 1) * auVar122._0_4_);
          local_6a0[1] = (uint)bVar19 * auVar114._4_4_ |
                         (uint)!bVar19 *
                         ((uint)bVar16 * local_320._4_4_ | (uint)!bVar16 * auVar122._4_4_);
          local_6a0[2] = (uint)bVar37 * auVar114._8_4_ |
                         (uint)!bVar37 *
                         ((uint)bVar27 * local_320._8_4_ | (uint)!bVar27 * auVar122._8_4_);
          local_6a0[3] = (uint)bVar25 * auVar114._12_4_ |
                         (uint)!bVar25 *
                         ((uint)bVar55 * local_320._12_4_ | (uint)!bVar55 * auVar122._12_4_);
          uStack_690 = (uint)bVar34 * auVar114._16_4_ |
                       (uint)!bVar34 *
                       ((uint)bVar31 * local_320._16_4_ | (uint)!bVar31 * auVar122._16_4_);
          uStack_68c = (uint)bVar43 * auVar114._20_4_ |
                       (uint)!bVar43 *
                       ((uint)bVar40 * local_320._20_4_ | (uint)!bVar40 * auVar122._20_4_);
          uStack_688 = (uint)bVar52 * auVar114._24_4_ |
                       (uint)!bVar52 *
                       ((uint)bVar49 * local_320._24_4_ | (uint)!bVar49 * auVar122._24_4_);
          uStack_684 = (uint)(bVar97 >> 7) * auVar114._28_4_ |
                       (uint)!(bool)(bVar97 >> 7) *
                       ((uint)bVar58 * local_320._28_4_ | (uint)!bVar58 * auVar122._28_4_);
          auVar101 = (undefined1  [8])context->scene;
          auVar114 = vblendmps_avx512vl(auVar199._0_32_,local_700);
          auVar142._4_4_ = (uint)(bVar98 >> 1 & 1) * auVar114._4_4_;
          auVar142._0_4_ = (uint)(bVar98 & 1) * auVar114._0_4_;
          auVar142._8_4_ = (uint)(bVar98 >> 2 & 1) * auVar114._8_4_;
          auVar142._12_4_ = (uint)(bVar98 >> 3 & 1) * auVar114._12_4_;
          auVar142._16_4_ = (uint)(bVar98 >> 4 & 1) * auVar114._16_4_;
          auVar142._20_4_ = (uint)(bVar98 >> 5 & 1) * auVar114._20_4_;
          auVar142._24_4_ = (uint)(bVar98 >> 6 & 1) * auVar114._24_4_;
          auVar142._28_4_ = (uint)(bVar98 >> 7) * auVar114._28_4_;
          auVar114 = vshufps_avx(auVar142,auVar142,0xb1);
          auVar114 = vminps_avx(auVar142,auVar114);
          auVar116 = vshufpd_avx(auVar114,auVar114,5);
          auVar114 = vminps_avx(auVar114,auVar116);
          auVar116 = vpermpd_avx2(auVar114,0x4e);
          auVar114 = vminps_avx(auVar114,auVar116);
          uVar77 = vcmpps_avx512vl(auVar142,auVar114,0);
          if (((byte)uVar77 & bVar98) != 0) {
            bVar98 = (byte)uVar77 & bVar98;
          }
          uVar99 = 0;
          for (uVar100 = (uint)bVar98; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
            uVar99 = uVar99 + 1;
          }
          auVar114 = vpcmpeqd_avx2(auVar115,auVar115);
          auVar200 = ZEXT3264(auVar114);
          do {
            local_810.hit = local_2c0;
            uVar102 = uVar99 & 0xff;
            uVar100 = *(uint *)(local_360 + (ulong)uVar102 * 4);
            pGVar11 = (((Scene *)auVar101)->geometries).items[uVar100].ptr;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
              uVar108 = (ulong)(byte)(~(byte)(1 << (uVar99 & 0x1f)) & (byte)uVar108);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar108 = (ulong)(uVar102 << 2);
                uVar189 = *(undefined4 *)((long)local_740 + uVar108);
                uVar4 = *(undefined4 *)(local_720 + uVar108);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_700 + uVar108);
                *(undefined4 *)(ray + k * 4 + 0x300) = *(undefined4 *)(local_6e0 + uVar108);
                *(undefined4 *)(ray + k * 4 + 0x340) = *(undefined4 *)((long)local_6c0 + uVar108);
                *(undefined4 *)(ray + k * 4 + 0x380) = *(undefined4 *)((long)local_6a0 + uVar108);
                *(undefined4 *)(ray + k * 4 + 0x3c0) = uVar189;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x440) =
                     *(undefined4 *)((long)&(line->primIDs).field_0 + uVar108);
                *(uint *)(ray + k * 4 + 0x480) = uVar100;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                return;
              }
              uVar96 = (ulong)(uVar102 * 4);
              local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_740 + uVar96)));
              local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_720 + uVar96)));
              auVar201 = vpbroadcastd_avx512f();
              local_180 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)((long)&(line->primIDs).field_0 + uVar96)));
              auVar202 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_6e0 + uVar96)));
              local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_6c0 + uVar96)));
              local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_6a0 + uVar96)));
              local_2c0[0] = (RTCHitN)auVar202[0];
              local_2c0[1] = (RTCHitN)auVar202[1];
              local_2c0[2] = (RTCHitN)auVar202[2];
              local_2c0[3] = (RTCHitN)auVar202[3];
              local_2c0[4] = (RTCHitN)auVar202[4];
              local_2c0[5] = (RTCHitN)auVar202[5];
              local_2c0[6] = (RTCHitN)auVar202[6];
              local_2c0[7] = (RTCHitN)auVar202[7];
              local_2c0[8] = (RTCHitN)auVar202[8];
              local_2c0[9] = (RTCHitN)auVar202[9];
              local_2c0[10] = (RTCHitN)auVar202[10];
              local_2c0[0xb] = (RTCHitN)auVar202[0xb];
              local_2c0[0xc] = (RTCHitN)auVar202[0xc];
              local_2c0[0xd] = (RTCHitN)auVar202[0xd];
              local_2c0[0xe] = (RTCHitN)auVar202[0xe];
              local_2c0[0xf] = (RTCHitN)auVar202[0xf];
              local_2c0[0x10] = (RTCHitN)auVar202[0x10];
              local_2c0[0x11] = (RTCHitN)auVar202[0x11];
              local_2c0[0x12] = (RTCHitN)auVar202[0x12];
              local_2c0[0x13] = (RTCHitN)auVar202[0x13];
              local_2c0[0x14] = (RTCHitN)auVar202[0x14];
              local_2c0[0x15] = (RTCHitN)auVar202[0x15];
              local_2c0[0x16] = (RTCHitN)auVar202[0x16];
              local_2c0[0x17] = (RTCHitN)auVar202[0x17];
              local_2c0[0x18] = (RTCHitN)auVar202[0x18];
              local_2c0[0x19] = (RTCHitN)auVar202[0x19];
              local_2c0[0x1a] = (RTCHitN)auVar202[0x1a];
              local_2c0[0x1b] = (RTCHitN)auVar202[0x1b];
              local_2c0[0x1c] = (RTCHitN)auVar202[0x1c];
              local_2c0[0x1d] = (RTCHitN)auVar202[0x1d];
              local_2c0[0x1e] = (RTCHitN)auVar202[0x1e];
              local_2c0[0x1f] = (RTCHitN)auVar202[0x1f];
              local_2c0[0x20] = (RTCHitN)auVar202[0x20];
              local_2c0[0x21] = (RTCHitN)auVar202[0x21];
              local_2c0[0x22] = (RTCHitN)auVar202[0x22];
              local_2c0[0x23] = (RTCHitN)auVar202[0x23];
              local_2c0[0x24] = (RTCHitN)auVar202[0x24];
              local_2c0[0x25] = (RTCHitN)auVar202[0x25];
              local_2c0[0x26] = (RTCHitN)auVar202[0x26];
              local_2c0[0x27] = (RTCHitN)auVar202[0x27];
              local_2c0[0x28] = (RTCHitN)auVar202[0x28];
              local_2c0[0x29] = (RTCHitN)auVar202[0x29];
              local_2c0[0x2a] = (RTCHitN)auVar202[0x2a];
              local_2c0[0x2b] = (RTCHitN)auVar202[0x2b];
              local_2c0[0x2c] = (RTCHitN)auVar202[0x2c];
              local_2c0[0x2d] = (RTCHitN)auVar202[0x2d];
              local_2c0[0x2e] = (RTCHitN)auVar202[0x2e];
              local_2c0[0x2f] = (RTCHitN)auVar202[0x2f];
              local_2c0[0x30] = (RTCHitN)auVar202[0x30];
              local_2c0[0x31] = (RTCHitN)auVar202[0x31];
              local_2c0[0x32] = (RTCHitN)auVar202[0x32];
              local_2c0[0x33] = (RTCHitN)auVar202[0x33];
              local_2c0[0x34] = (RTCHitN)auVar202[0x34];
              local_2c0[0x35] = (RTCHitN)auVar202[0x35];
              local_2c0[0x36] = (RTCHitN)auVar202[0x36];
              local_2c0[0x37] = (RTCHitN)auVar202[0x37];
              local_2c0[0x38] = (RTCHitN)auVar202[0x38];
              local_2c0[0x39] = (RTCHitN)auVar202[0x39];
              local_2c0[0x3a] = (RTCHitN)auVar202[0x3a];
              local_2c0[0x3b] = (RTCHitN)auVar202[0x3b];
              local_2c0[0x3c] = (RTCHitN)auVar202[0x3c];
              local_2c0[0x3d] = (RTCHitN)auVar202[0x3d];
              local_2c0[0x3e] = (RTCHitN)auVar202[0x3e];
              local_2c0[0x3f] = (RTCHitN)auVar202[0x3f];
              local_140 = vmovdqa64_avx512f(auVar201);
              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
              *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_700 + uVar96);
              local_680 = vmovdqa64_avx512f(auVar170);
              local_810.valid = (int *)local_680;
              local_810.geometryUserPtr = pGVar11->userPtr;
              local_810.context = context->user;
              local_810.N = 0x10;
              auVar201 = vmovdqa64_avx512f(auVar170);
              local_760 = auVar178._0_32_;
              local_780 = auVar191._0_32_;
              local_640 = vmovdqa64_avx512f(auVar170);
              local_7e0 = auVar101;
              local_7a0._0_4_ = (int)uVar108;
              local_810.ray = (RTCRayN *)ray;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar114 = ZEXT1632(auVar200._0_16_);
                (*pGVar11->intersectionFilterN)(&local_810);
                auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
                auVar200 = ZEXT3264(auVar114);
                auVar170 = vmovdqa64_avx512f(local_640);
                uVar108 = (ulong)(uint)local_7a0._0_4_;
                auVar191 = ZEXT3264(local_780);
                auVar178 = ZEXT3264(local_760);
                auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar199 = ZEXT3264(auVar114);
                auVar201 = vmovdqa64_avx512f(local_680);
                auVar101 = local_7e0;
              }
              bVar98 = (byte)uVar108;
              uVar77 = vptestmd_avx512f(auVar201,auVar201);
              if ((short)uVar77 == 0) {
LAB_019868ee:
                *(int *)(ray + k * 4 + 0x200) = auVar191._0_4_;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar114 = ZEXT1632(auVar200._0_16_);
                  (*p_Var13)(&local_810);
                  auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
                  auVar200 = ZEXT3264(auVar114);
                  auVar170 = vmovdqa64_avx512f(local_640);
                  bVar98 = local_7a0[0];
                  auVar191 = ZEXT3264(local_780);
                  auVar178 = ZEXT3264(local_760);
                  auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar199 = ZEXT3264(auVar114);
                  auVar201 = vmovdqa64_avx512f(local_680);
                  auVar101 = local_7e0;
                }
                uVar108 = vptestmd_avx512f(auVar201,auVar201);
                if ((short)uVar108 == 0) goto LAB_019868ee;
                iVar109 = *(int *)(local_810.hit + 4);
                iVar145 = *(int *)(local_810.hit + 8);
                iVar146 = *(int *)(local_810.hit + 0xc);
                iVar147 = *(int *)(local_810.hit + 0x10);
                iVar148 = *(int *)(local_810.hit + 0x14);
                iVar149 = *(int *)(local_810.hit + 0x18);
                iVar150 = *(int *)(local_810.hit + 0x1c);
                iVar151 = *(int *)(local_810.hit + 0x20);
                iVar89 = *(int *)(local_810.hit + 0x24);
                iVar90 = *(int *)(local_810.hit + 0x28);
                iVar91 = *(int *)(local_810.hit + 0x2c);
                iVar92 = *(int *)(local_810.hit + 0x30);
                iVar93 = *(int *)(local_810.hit + 0x34);
                iVar94 = *(int *)(local_810.hit + 0x38);
                iVar95 = *(int *)(local_810.hit + 0x3c);
                bVar106 = (byte)uVar108;
                bVar14 = (bool)((byte)(uVar108 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar108 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar108 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar108 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar108 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar108 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar108 >> 7) & 1);
                bVar97 = (byte)(uVar108 >> 8);
                bVar21 = (bool)((byte)(uVar108 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar108 >> 10) & 1);
                bVar27 = (bool)((byte)(uVar108 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar108 >> 0xc) & 1);
                bVar36 = (bool)((byte)(uVar108 >> 0xd) & 1);
                bVar37 = (bool)((byte)(uVar108 >> 0xe) & 1);
                bVar45 = SUB81(uVar108 >> 0xf,0);
                *(uint *)(local_810.ray + 0x300) =
                     (uint)(bVar106 & 1) * *(int *)local_810.hit |
                     (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x300);
                *(uint *)(local_810.ray + 0x304) =
                     (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 0x304);
                *(uint *)(local_810.ray + 0x308) =
                     (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x308);
                *(uint *)(local_810.ray + 0x30c) =
                     (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x30c);
                *(uint *)(local_810.ray + 0x310) =
                     (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x310);
                *(uint *)(local_810.ray + 0x314) =
                     (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x314);
                *(uint *)(local_810.ray + 0x318) =
                     (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x318);
                *(uint *)(local_810.ray + 0x31c) =
                     (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x31c);
                *(uint *)(local_810.ray + 800) =
                     (uint)(bVar97 & 1) * iVar151 |
                     (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 800);
                *(uint *)(local_810.ray + 0x324) =
                     (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x324);
                *(uint *)(local_810.ray + 0x328) =
                     (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 0x328);
                *(uint *)(local_810.ray + 0x32c) =
                     (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x32c);
                *(uint *)(local_810.ray + 0x330) =
                     (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x330);
                *(uint *)(local_810.ray + 0x334) =
                     (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x334);
                *(uint *)(local_810.ray + 0x338) =
                     (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x338);
                *(uint *)(local_810.ray + 0x33c) =
                     (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x33c);
                iVar109 = *(int *)(local_810.hit + 0x44);
                iVar145 = *(int *)(local_810.hit + 0x48);
                iVar146 = *(int *)(local_810.hit + 0x4c);
                iVar147 = *(int *)(local_810.hit + 0x50);
                iVar148 = *(int *)(local_810.hit + 0x54);
                iVar149 = *(int *)(local_810.hit + 0x58);
                iVar150 = *(int *)(local_810.hit + 0x5c);
                iVar151 = *(int *)(local_810.hit + 0x60);
                iVar89 = *(int *)(local_810.hit + 100);
                iVar90 = *(int *)(local_810.hit + 0x68);
                iVar91 = *(int *)(local_810.hit + 0x6c);
                iVar92 = *(int *)(local_810.hit + 0x70);
                iVar93 = *(int *)(local_810.hit + 0x74);
                iVar94 = *(int *)(local_810.hit + 0x78);
                iVar95 = *(int *)(local_810.hit + 0x7c);
                bVar14 = (bool)((byte)(uVar108 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar108 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar108 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar108 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar108 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar108 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar108 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar108 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar108 >> 10) & 1);
                bVar27 = (bool)((byte)(uVar108 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar108 >> 0xc) & 1);
                bVar36 = (bool)((byte)(uVar108 >> 0xd) & 1);
                bVar37 = (bool)((byte)(uVar108 >> 0xe) & 1);
                bVar45 = SUB81(uVar108 >> 0xf,0);
                *(uint *)(local_810.ray + 0x340) =
                     (uint)(bVar106 & 1) * *(int *)(local_810.hit + 0x40) |
                     (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x340);
                *(uint *)(local_810.ray + 0x344) =
                     (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 0x344);
                *(uint *)(local_810.ray + 0x348) =
                     (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x348);
                *(uint *)(local_810.ray + 0x34c) =
                     (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x34c);
                *(uint *)(local_810.ray + 0x350) =
                     (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x350);
                *(uint *)(local_810.ray + 0x354) =
                     (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x354);
                *(uint *)(local_810.ray + 0x358) =
                     (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x358);
                *(uint *)(local_810.ray + 0x35c) =
                     (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x35c);
                *(uint *)(local_810.ray + 0x360) =
                     (uint)(bVar97 & 1) * iVar151 |
                     (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 0x360);
                *(uint *)(local_810.ray + 0x364) =
                     (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x364);
                *(uint *)(local_810.ray + 0x368) =
                     (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 0x368);
                *(uint *)(local_810.ray + 0x36c) =
                     (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x36c);
                *(uint *)(local_810.ray + 0x370) =
                     (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x370);
                *(uint *)(local_810.ray + 0x374) =
                     (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x374);
                *(uint *)(local_810.ray + 0x378) =
                     (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x378);
                *(uint *)(local_810.ray + 0x37c) =
                     (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x37c);
                iVar109 = *(int *)(local_810.hit + 0x84);
                iVar145 = *(int *)(local_810.hit + 0x88);
                iVar146 = *(int *)(local_810.hit + 0x8c);
                iVar147 = *(int *)(local_810.hit + 0x90);
                iVar148 = *(int *)(local_810.hit + 0x94);
                iVar149 = *(int *)(local_810.hit + 0x98);
                iVar150 = *(int *)(local_810.hit + 0x9c);
                iVar151 = *(int *)(local_810.hit + 0xa0);
                iVar89 = *(int *)(local_810.hit + 0xa4);
                iVar90 = *(int *)(local_810.hit + 0xa8);
                iVar91 = *(int *)(local_810.hit + 0xac);
                iVar92 = *(int *)(local_810.hit + 0xb0);
                iVar93 = *(int *)(local_810.hit + 0xb4);
                iVar94 = *(int *)(local_810.hit + 0xb8);
                iVar95 = *(int *)(local_810.hit + 0xbc);
                bVar14 = (bool)((byte)(uVar108 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar108 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar108 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar108 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar108 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar108 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar108 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar108 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar108 >> 10) & 1);
                bVar27 = (bool)((byte)(uVar108 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar108 >> 0xc) & 1);
                bVar36 = (bool)((byte)(uVar108 >> 0xd) & 1);
                bVar37 = (bool)((byte)(uVar108 >> 0xe) & 1);
                bVar45 = SUB81(uVar108 >> 0xf,0);
                *(uint *)(local_810.ray + 0x380) =
                     (uint)(bVar106 & 1) * *(int *)(local_810.hit + 0x80) |
                     (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x380);
                *(uint *)(local_810.ray + 900) =
                     (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 900);
                *(uint *)(local_810.ray + 0x388) =
                     (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x388);
                *(uint *)(local_810.ray + 0x38c) =
                     (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x38c);
                *(uint *)(local_810.ray + 0x390) =
                     (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x390);
                *(uint *)(local_810.ray + 0x394) =
                     (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x394);
                *(uint *)(local_810.ray + 0x398) =
                     (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x398);
                *(uint *)(local_810.ray + 0x39c) =
                     (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x39c);
                *(uint *)(local_810.ray + 0x3a0) =
                     (uint)(bVar97 & 1) * iVar151 |
                     (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 0x3a0);
                *(uint *)(local_810.ray + 0x3a4) =
                     (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x3a4);
                *(uint *)(local_810.ray + 0x3a8) =
                     (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 0x3a8);
                *(uint *)(local_810.ray + 0x3ac) =
                     (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x3ac);
                *(uint *)(local_810.ray + 0x3b0) =
                     (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x3b0);
                *(uint *)(local_810.ray + 0x3b4) =
                     (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x3b4);
                *(uint *)(local_810.ray + 0x3b8) =
                     (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x3b8);
                *(uint *)(local_810.ray + 0x3bc) =
                     (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x3bc);
                iVar109 = *(int *)(local_810.hit + 0xc4);
                iVar145 = *(int *)(local_810.hit + 200);
                iVar146 = *(int *)(local_810.hit + 0xcc);
                iVar147 = *(int *)(local_810.hit + 0xd0);
                iVar148 = *(int *)(local_810.hit + 0xd4);
                iVar149 = *(int *)(local_810.hit + 0xd8);
                iVar150 = *(int *)(local_810.hit + 0xdc);
                iVar151 = *(int *)(local_810.hit + 0xe0);
                iVar89 = *(int *)(local_810.hit + 0xe4);
                iVar90 = *(int *)(local_810.hit + 0xe8);
                iVar91 = *(int *)(local_810.hit + 0xec);
                iVar92 = *(int *)(local_810.hit + 0xf0);
                iVar93 = *(int *)(local_810.hit + 0xf4);
                iVar94 = *(int *)(local_810.hit + 0xf8);
                iVar95 = *(int *)(local_810.hit + 0xfc);
                bVar14 = (bool)((byte)(uVar108 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar108 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar108 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar108 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar108 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar108 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar108 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar108 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar108 >> 10) & 1);
                bVar27 = (bool)((byte)(uVar108 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar108 >> 0xc) & 1);
                bVar36 = (bool)((byte)(uVar108 >> 0xd) & 1);
                bVar37 = (bool)((byte)(uVar108 >> 0xe) & 1);
                bVar45 = SUB81(uVar108 >> 0xf,0);
                *(uint *)(local_810.ray + 0x3c0) =
                     (uint)(bVar106 & 1) * *(int *)(local_810.hit + 0xc0) |
                     (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x3c0);
                *(uint *)(local_810.ray + 0x3c4) =
                     (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 0x3c4);
                *(uint *)(local_810.ray + 0x3c8) =
                     (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x3c8);
                *(uint *)(local_810.ray + 0x3cc) =
                     (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x3cc);
                *(uint *)(local_810.ray + 0x3d0) =
                     (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x3d0);
                *(uint *)(local_810.ray + 0x3d4) =
                     (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x3d4);
                *(uint *)(local_810.ray + 0x3d8) =
                     (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x3d8);
                *(uint *)(local_810.ray + 0x3dc) =
                     (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x3dc);
                *(uint *)(local_810.ray + 0x3e0) =
                     (uint)(bVar97 & 1) * iVar151 |
                     (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 0x3e0);
                *(uint *)(local_810.ray + 0x3e4) =
                     (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x3e4);
                *(uint *)(local_810.ray + 1000) =
                     (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 1000);
                *(uint *)(local_810.ray + 0x3ec) =
                     (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x3ec);
                *(uint *)(local_810.ray + 0x3f0) =
                     (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x3f0);
                *(uint *)(local_810.ray + 0x3f4) =
                     (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x3f4);
                *(uint *)(local_810.ray + 0x3f8) =
                     (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x3f8);
                *(uint *)(local_810.ray + 0x3fc) =
                     (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x3fc);
                iVar109 = *(int *)(local_810.hit + 0x104);
                iVar145 = *(int *)(local_810.hit + 0x108);
                iVar146 = *(int *)(local_810.hit + 0x10c);
                iVar147 = *(int *)(local_810.hit + 0x110);
                iVar148 = *(int *)(local_810.hit + 0x114);
                iVar149 = *(int *)(local_810.hit + 0x118);
                iVar150 = *(int *)(local_810.hit + 0x11c);
                iVar151 = *(int *)(local_810.hit + 0x120);
                iVar89 = *(int *)(local_810.hit + 0x124);
                iVar90 = *(int *)(local_810.hit + 0x128);
                iVar91 = *(int *)(local_810.hit + 300);
                iVar92 = *(int *)(local_810.hit + 0x130);
                iVar93 = *(int *)(local_810.hit + 0x134);
                iVar94 = *(int *)(local_810.hit + 0x138);
                iVar95 = *(int *)(local_810.hit + 0x13c);
                bVar14 = (bool)((byte)(uVar108 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar108 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar108 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar108 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar108 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar108 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar108 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar108 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar108 >> 10) & 1);
                bVar27 = (bool)((byte)(uVar108 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar108 >> 0xc) & 1);
                bVar36 = (bool)((byte)(uVar108 >> 0xd) & 1);
                bVar37 = (bool)((byte)(uVar108 >> 0xe) & 1);
                bVar45 = SUB81(uVar108 >> 0xf,0);
                *(uint *)(local_810.ray + 0x400) =
                     (uint)(bVar106 & 1) * *(int *)(local_810.hit + 0x100) |
                     (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x400);
                *(uint *)(local_810.ray + 0x404) =
                     (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 0x404);
                *(uint *)(local_810.ray + 0x408) =
                     (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x408);
                *(uint *)(local_810.ray + 0x40c) =
                     (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x40c);
                *(uint *)(local_810.ray + 0x410) =
                     (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x410);
                *(uint *)(local_810.ray + 0x414) =
                     (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x414);
                *(uint *)(local_810.ray + 0x418) =
                     (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x418);
                *(uint *)(local_810.ray + 0x41c) =
                     (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x41c);
                *(uint *)(local_810.ray + 0x420) =
                     (uint)(bVar97 & 1) * iVar151 |
                     (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 0x420);
                *(uint *)(local_810.ray + 0x424) =
                     (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x424);
                *(uint *)(local_810.ray + 0x428) =
                     (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 0x428);
                *(uint *)(local_810.ray + 0x42c) =
                     (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x42c);
                *(uint *)(local_810.ray + 0x430) =
                     (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x430);
                *(uint *)(local_810.ray + 0x434) =
                     (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x434);
                *(uint *)(local_810.ray + 0x438) =
                     (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x438);
                *(uint *)(local_810.ray + 0x43c) =
                     (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x43c);
                auVar201 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x140));
                auVar201 = vmovdqu32_avx512f(auVar201);
                *(undefined1 (*) [64])(local_810.ray + 0x440) = auVar201;
                auVar201 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x180));
                auVar201 = vmovdqu32_avx512f(auVar201);
                *(undefined1 (*) [64])(local_810.ray + 0x480) = auVar201;
                auVar201 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x1c0));
                auVar201 = vmovdqa32_avx512f(auVar201);
                *(undefined1 (*) [64])(local_810.ray + 0x4c0) = auVar201;
                auVar201 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x200));
                auVar201 = vmovdqa32_avx512f(auVar201);
                *(undefined1 (*) [64])(local_810.ray + 0x500) = auVar201;
                auVar191 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
              }
              uVar189 = auVar191._0_4_;
              auVar142._4_4_ = uVar189;
              auVar142._0_4_ = uVar189;
              auVar142._8_4_ = uVar189;
              auVar142._12_4_ = uVar189;
              auVar142._16_4_ = uVar189;
              auVar142._20_4_ = uVar189;
              auVar142._24_4_ = uVar189;
              auVar142._28_4_ = uVar189;
              uVar108 = vcmpps_avx512vl(auVar178._0_32_,auVar142,2);
              uVar108 = (~(byte)(1 << (uVar99 & 0x1f)) & bVar98) & uVar108;
            }
            bVar98 = (byte)uVar108;
            if (bVar98 == 0) {
              return;
            }
            auVar114 = vblendmps_avx512vl(auVar199._0_32_,auVar178._0_32_);
            auVar143._0_4_ =
                 (uint)(bVar98 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar142._0_4_;
            bVar14 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * auVar142._4_4_;
            bVar14 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * auVar142._8_4_;
            bVar14 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * auVar142._12_4_;
            bVar14 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar143._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * auVar142._16_4_;
            bVar14 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar143._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * auVar142._20_4_;
            bVar14 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar143._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * auVar142._24_4_;
            bVar14 = SUB81(uVar108 >> 7,0);
            auVar143._28_4_ = (uint)bVar14 * auVar114._28_4_ | (uint)!bVar14 * auVar142._28_4_;
            auVar114 = vshufps_avx(auVar143,auVar143,0xb1);
            auVar114 = vminps_avx(auVar143,auVar114);
            auVar115 = vshufpd_avx(auVar114,auVar114,5);
            auVar114 = vminps_avx(auVar114,auVar115);
            auVar115 = vpermpd_avx2(auVar114,0x4e);
            auVar114 = vminps_avx(auVar114,auVar115);
            uVar77 = vcmpps_avx512vl(auVar143,auVar114,0);
            bVar98 = (byte)uVar77 & bVar98;
            uVar100 = (uint)uVar108;
            if (bVar98 != 0) {
              uVar100 = (uint)bVar98;
            }
            uVar99 = 0;
            for (; auVar142 = auVar143, (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
              uVar99 = uVar99 + 1;
            }
          } while( true );
        }
        local_3a0 = auVar163._0_32_;
        local_380 = auVar114;
        uVar108 = (ulong)(uVar102 * 4);
        local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_740 + uVar108)));
        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_720 + uVar108)));
        auVar163 = vpbroadcastd_avx512f();
        local_180 = vbroadcastss_avx512f
                              (ZEXT416(*(uint *)((long)&(line->primIDs).field_0 + uVar108)));
        auVar167 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_6e0 + uVar108)));
        local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_6c0 + uVar108)));
        local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_6a0 + uVar108)));
        local_2c0[0] = (RTCHitN)auVar167[0];
        local_2c0[1] = (RTCHitN)auVar167[1];
        local_2c0[2] = (RTCHitN)auVar167[2];
        local_2c0[3] = (RTCHitN)auVar167[3];
        local_2c0[4] = (RTCHitN)auVar167[4];
        local_2c0[5] = (RTCHitN)auVar167[5];
        local_2c0[6] = (RTCHitN)auVar167[6];
        local_2c0[7] = (RTCHitN)auVar167[7];
        local_2c0[8] = (RTCHitN)auVar167[8];
        local_2c0[9] = (RTCHitN)auVar167[9];
        local_2c0[10] = (RTCHitN)auVar167[10];
        local_2c0[0xb] = (RTCHitN)auVar167[0xb];
        local_2c0[0xc] = (RTCHitN)auVar167[0xc];
        local_2c0[0xd] = (RTCHitN)auVar167[0xd];
        local_2c0[0xe] = (RTCHitN)auVar167[0xe];
        local_2c0[0xf] = (RTCHitN)auVar167[0xf];
        local_2c0[0x10] = (RTCHitN)auVar167[0x10];
        local_2c0[0x11] = (RTCHitN)auVar167[0x11];
        local_2c0[0x12] = (RTCHitN)auVar167[0x12];
        local_2c0[0x13] = (RTCHitN)auVar167[0x13];
        local_2c0[0x14] = (RTCHitN)auVar167[0x14];
        local_2c0[0x15] = (RTCHitN)auVar167[0x15];
        local_2c0[0x16] = (RTCHitN)auVar167[0x16];
        local_2c0[0x17] = (RTCHitN)auVar167[0x17];
        local_2c0[0x18] = (RTCHitN)auVar167[0x18];
        local_2c0[0x19] = (RTCHitN)auVar167[0x19];
        local_2c0[0x1a] = (RTCHitN)auVar167[0x1a];
        local_2c0[0x1b] = (RTCHitN)auVar167[0x1b];
        local_2c0[0x1c] = (RTCHitN)auVar167[0x1c];
        local_2c0[0x1d] = (RTCHitN)auVar167[0x1d];
        local_2c0[0x1e] = (RTCHitN)auVar167[0x1e];
        local_2c0[0x1f] = (RTCHitN)auVar167[0x1f];
        local_2c0[0x20] = (RTCHitN)auVar167[0x20];
        local_2c0[0x21] = (RTCHitN)auVar167[0x21];
        local_2c0[0x22] = (RTCHitN)auVar167[0x22];
        local_2c0[0x23] = (RTCHitN)auVar167[0x23];
        local_2c0[0x24] = (RTCHitN)auVar167[0x24];
        local_2c0[0x25] = (RTCHitN)auVar167[0x25];
        local_2c0[0x26] = (RTCHitN)auVar167[0x26];
        local_2c0[0x27] = (RTCHitN)auVar167[0x27];
        local_2c0[0x28] = (RTCHitN)auVar167[0x28];
        local_2c0[0x29] = (RTCHitN)auVar167[0x29];
        local_2c0[0x2a] = (RTCHitN)auVar167[0x2a];
        local_2c0[0x2b] = (RTCHitN)auVar167[0x2b];
        local_2c0[0x2c] = (RTCHitN)auVar167[0x2c];
        local_2c0[0x2d] = (RTCHitN)auVar167[0x2d];
        local_2c0[0x2e] = (RTCHitN)auVar167[0x2e];
        local_2c0[0x2f] = (RTCHitN)auVar167[0x2f];
        local_2c0[0x30] = (RTCHitN)auVar167[0x30];
        local_2c0[0x31] = (RTCHitN)auVar167[0x31];
        local_2c0[0x32] = (RTCHitN)auVar167[0x32];
        local_2c0[0x33] = (RTCHitN)auVar167[0x33];
        local_2c0[0x34] = (RTCHitN)auVar167[0x34];
        local_2c0[0x35] = (RTCHitN)auVar167[0x35];
        local_2c0[0x36] = (RTCHitN)auVar167[0x36];
        local_2c0[0x37] = (RTCHitN)auVar167[0x37];
        local_2c0[0x38] = (RTCHitN)auVar167[0x38];
        local_2c0[0x39] = (RTCHitN)auVar167[0x39];
        local_2c0[0x3a] = (RTCHitN)auVar167[0x3a];
        local_2c0[0x3b] = (RTCHitN)auVar167[0x3b];
        local_2c0[0x3c] = (RTCHitN)auVar167[0x3c];
        local_2c0[0x3d] = (RTCHitN)auVar167[0x3d];
        local_2c0[0x3e] = (RTCHitN)auVar167[0x3e];
        local_2c0[0x3f] = (RTCHitN)auVar167[0x3f];
        local_140 = vmovdqa64_avx512f(auVar163);
        local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
        local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
        *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_700 + uVar108);
        local_680 = vmovdqa64_avx512f(auVar170);
        local_810.valid = (int *)local_680;
        local_810.geometryUserPtr = pGVar11->userPtr;
        local_810.context = context->user;
        local_810.N = 0x10;
        auVar144 = vmovdqa64_avx512f(auVar170);
        local_760 = auVar178._0_32_;
        local_3c0 = auVar111;
        local_3e0 = auVar113;
        local_400 = auVar117;
        local_420 = auVar118;
        local_440 = auVar121;
        local_460 = auVar122;
        local_780 = auVar191._0_32_;
        local_480 = auVar126;
        local_4a0 = auVar127;
        local_4c0 = auVar166;
        local_640 = vmovdqa64_avx512f(auVar170);
        local_4e0 = auVar124;
        local_500 = auVar168;
        local_520 = auVar141;
        local_540 = auVar119;
        local_560 = auVar120;
        local_580 = auVar123;
        local_5a0 = auVar134;
        local_5c0 = auVar164;
        local_5e0 = auVar125;
        local_600 = auVar116;
        uVar108 = uVar107;
        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
          auVar173 = ZEXT1664(auVar173._0_16_);
          auVar114 = ZEXT1632(auVar188._0_16_);
          (*pGVar11->intersectionFilterN)(&local_810);
          auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
          auVar188 = ZEXT3264(auVar114);
          auVar175 = ZEXT3264(local_600);
          auVar207 = ZEXT3264(local_5e0);
          auVar196 = ZEXT3264(local_5c0);
          auVar195 = ZEXT3264(local_5a0);
          uVar108 = uVar107 & 0xffff;
          auVar186 = ZEXT3264(local_580);
          auVar194 = ZEXT3264(local_560);
          auVar193 = ZEXT3264(local_540);
          auVar192 = ZEXT3264(local_520);
          auVar198 = ZEXT3264(local_500);
          auVar206 = ZEXT3264(local_4e0);
          auVar170 = vmovdqa64_avx512f(local_640);
          auVar197 = ZEXT3264(local_4c0);
          auVar209 = ZEXT3264(local_4a0);
          auVar208 = ZEXT3264(local_480);
          auVar191 = ZEXT3264(local_780);
          auVar205 = ZEXT3264(local_460);
          auVar204 = ZEXT3264(local_440);
          auVar203 = ZEXT3264(local_420);
          auVar202 = ZEXT3264(local_400);
          auVar201 = ZEXT3264(local_3e0);
          auVar200 = ZEXT3264(local_3c0);
          auVar178 = ZEXT3264(local_760);
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar199 = ZEXT3264(auVar114);
          auVar144 = vmovdqa64_avx512f(local_680);
        }
        uVar77 = vptestmd_avx512f(auVar144,auVar144);
        auVar167 = ZEXT3264(local_380);
        auVar163 = ZEXT3264(local_3a0);
        if ((short)uVar77 == 0) {
LAB_01986361:
          *(int *)(ray + k * 4 + 0x200) = auVar191._0_4_;
        }
        else {
          p_Var13 = context->args->filter;
          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
            auVar173 = ZEXT1664(auVar173._0_16_);
            auVar114 = ZEXT1632(auVar188._0_16_);
            (*p_Var13)(&local_810);
            auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
            auVar188 = ZEXT3264(auVar114);
            auVar163 = ZEXT3264(local_3a0);
            auVar167 = ZEXT3264(local_380);
            auVar175 = ZEXT3264(local_600);
            auVar207 = ZEXT3264(local_5e0);
            auVar196 = ZEXT3264(local_5c0);
            auVar195 = ZEXT3264(local_5a0);
            uVar108 = uVar107 & 0xffff;
            auVar186 = ZEXT3264(local_580);
            auVar194 = ZEXT3264(local_560);
            auVar193 = ZEXT3264(local_540);
            auVar192 = ZEXT3264(local_520);
            auVar198 = ZEXT3264(local_500);
            auVar206 = ZEXT3264(local_4e0);
            auVar170 = vmovdqa64_avx512f(local_640);
            auVar197 = ZEXT3264(local_4c0);
            auVar209 = ZEXT3264(local_4a0);
            auVar208 = ZEXT3264(local_480);
            auVar191 = ZEXT3264(local_780);
            auVar205 = ZEXT3264(local_460);
            auVar204 = ZEXT3264(local_440);
            auVar203 = ZEXT3264(local_420);
            auVar202 = ZEXT3264(local_400);
            auVar201 = ZEXT3264(local_3e0);
            auVar200 = ZEXT3264(local_3c0);
            auVar178 = ZEXT3264(local_760);
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar199 = ZEXT3264(auVar114);
            auVar144 = vmovdqa64_avx512f(local_680);
          }
          uVar96 = vptestmd_avx512f(auVar144,auVar144);
          if ((short)uVar96 == 0) goto LAB_01986361;
          iVar109 = *(int *)(local_810.hit + 4);
          iVar145 = *(int *)(local_810.hit + 8);
          iVar146 = *(int *)(local_810.hit + 0xc);
          iVar147 = *(int *)(local_810.hit + 0x10);
          iVar148 = *(int *)(local_810.hit + 0x14);
          iVar149 = *(int *)(local_810.hit + 0x18);
          iVar150 = *(int *)(local_810.hit + 0x1c);
          iVar151 = *(int *)(local_810.hit + 0x20);
          iVar89 = *(int *)(local_810.hit + 0x24);
          iVar90 = *(int *)(local_810.hit + 0x28);
          iVar91 = *(int *)(local_810.hit + 0x2c);
          iVar92 = *(int *)(local_810.hit + 0x30);
          iVar93 = *(int *)(local_810.hit + 0x34);
          iVar94 = *(int *)(local_810.hit + 0x38);
          iVar95 = *(int *)(local_810.hit + 0x3c);
          bVar106 = (byte)uVar96;
          bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
          bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
          bVar97 = (byte)(uVar96 >> 8);
          bVar21 = (bool)((byte)(uVar96 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar96 >> 10) & 1);
          bVar27 = (bool)((byte)(uVar96 >> 0xb) & 1);
          bVar28 = (bool)((byte)(uVar96 >> 0xc) & 1);
          bVar36 = (bool)((byte)(uVar96 >> 0xd) & 1);
          bVar37 = (bool)((byte)(uVar96 >> 0xe) & 1);
          bVar45 = SUB81(uVar96 >> 0xf,0);
          *(uint *)(local_810.ray + 0x300) =
               (uint)(bVar106 & 1) * *(int *)local_810.hit |
               (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x300);
          *(uint *)(local_810.ray + 0x304) =
               (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 0x304);
          *(uint *)(local_810.ray + 0x308) =
               (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x308);
          *(uint *)(local_810.ray + 0x30c) =
               (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x30c);
          *(uint *)(local_810.ray + 0x310) =
               (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x310);
          *(uint *)(local_810.ray + 0x314) =
               (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x314);
          *(uint *)(local_810.ray + 0x318) =
               (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x318);
          *(uint *)(local_810.ray + 0x31c) =
               (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x31c);
          *(uint *)(local_810.ray + 800) =
               (uint)(bVar97 & 1) * iVar151 |
               (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 800);
          *(uint *)(local_810.ray + 0x324) =
               (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x324);
          *(uint *)(local_810.ray + 0x328) =
               (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 0x328);
          *(uint *)(local_810.ray + 0x32c) =
               (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x32c);
          *(uint *)(local_810.ray + 0x330) =
               (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x330);
          *(uint *)(local_810.ray + 0x334) =
               (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x334);
          *(uint *)(local_810.ray + 0x338) =
               (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x338);
          *(uint *)(local_810.ray + 0x33c) =
               (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x33c);
          iVar109 = *(int *)(local_810.hit + 0x44);
          iVar145 = *(int *)(local_810.hit + 0x48);
          iVar146 = *(int *)(local_810.hit + 0x4c);
          iVar147 = *(int *)(local_810.hit + 0x50);
          iVar148 = *(int *)(local_810.hit + 0x54);
          iVar149 = *(int *)(local_810.hit + 0x58);
          iVar150 = *(int *)(local_810.hit + 0x5c);
          iVar151 = *(int *)(local_810.hit + 0x60);
          iVar89 = *(int *)(local_810.hit + 100);
          iVar90 = *(int *)(local_810.hit + 0x68);
          iVar91 = *(int *)(local_810.hit + 0x6c);
          iVar92 = *(int *)(local_810.hit + 0x70);
          iVar93 = *(int *)(local_810.hit + 0x74);
          iVar94 = *(int *)(local_810.hit + 0x78);
          iVar95 = *(int *)(local_810.hit + 0x7c);
          bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
          bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
          bVar21 = (bool)((byte)(uVar96 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar96 >> 10) & 1);
          bVar27 = (bool)((byte)(uVar96 >> 0xb) & 1);
          bVar28 = (bool)((byte)(uVar96 >> 0xc) & 1);
          bVar36 = (bool)((byte)(uVar96 >> 0xd) & 1);
          bVar37 = (bool)((byte)(uVar96 >> 0xe) & 1);
          bVar45 = SUB81(uVar96 >> 0xf,0);
          *(uint *)(local_810.ray + 0x340) =
               (uint)(bVar106 & 1) * *(int *)(local_810.hit + 0x40) |
               (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x340);
          *(uint *)(local_810.ray + 0x344) =
               (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 0x344);
          *(uint *)(local_810.ray + 0x348) =
               (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x348);
          *(uint *)(local_810.ray + 0x34c) =
               (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x34c);
          *(uint *)(local_810.ray + 0x350) =
               (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x350);
          *(uint *)(local_810.ray + 0x354) =
               (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x354);
          *(uint *)(local_810.ray + 0x358) =
               (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x358);
          *(uint *)(local_810.ray + 0x35c) =
               (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x35c);
          *(uint *)(local_810.ray + 0x360) =
               (uint)(bVar97 & 1) * iVar151 |
               (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 0x360);
          *(uint *)(local_810.ray + 0x364) =
               (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x364);
          *(uint *)(local_810.ray + 0x368) =
               (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 0x368);
          *(uint *)(local_810.ray + 0x36c) =
               (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x36c);
          *(uint *)(local_810.ray + 0x370) =
               (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x370);
          *(uint *)(local_810.ray + 0x374) =
               (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x374);
          *(uint *)(local_810.ray + 0x378) =
               (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x378);
          *(uint *)(local_810.ray + 0x37c) =
               (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x37c);
          iVar109 = *(int *)(local_810.hit + 0x84);
          iVar145 = *(int *)(local_810.hit + 0x88);
          iVar146 = *(int *)(local_810.hit + 0x8c);
          iVar147 = *(int *)(local_810.hit + 0x90);
          iVar148 = *(int *)(local_810.hit + 0x94);
          iVar149 = *(int *)(local_810.hit + 0x98);
          iVar150 = *(int *)(local_810.hit + 0x9c);
          iVar151 = *(int *)(local_810.hit + 0xa0);
          iVar89 = *(int *)(local_810.hit + 0xa4);
          iVar90 = *(int *)(local_810.hit + 0xa8);
          iVar91 = *(int *)(local_810.hit + 0xac);
          iVar92 = *(int *)(local_810.hit + 0xb0);
          iVar93 = *(int *)(local_810.hit + 0xb4);
          iVar94 = *(int *)(local_810.hit + 0xb8);
          iVar95 = *(int *)(local_810.hit + 0xbc);
          bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
          bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
          bVar21 = (bool)((byte)(uVar96 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar96 >> 10) & 1);
          bVar27 = (bool)((byte)(uVar96 >> 0xb) & 1);
          bVar28 = (bool)((byte)(uVar96 >> 0xc) & 1);
          bVar36 = (bool)((byte)(uVar96 >> 0xd) & 1);
          bVar37 = (bool)((byte)(uVar96 >> 0xe) & 1);
          bVar45 = SUB81(uVar96 >> 0xf,0);
          *(uint *)(local_810.ray + 0x380) =
               (uint)(bVar106 & 1) * *(int *)(local_810.hit + 0x80) |
               (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x380);
          *(uint *)(local_810.ray + 900) =
               (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 900);
          *(uint *)(local_810.ray + 0x388) =
               (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x388);
          *(uint *)(local_810.ray + 0x38c) =
               (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x38c);
          *(uint *)(local_810.ray + 0x390) =
               (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x390);
          *(uint *)(local_810.ray + 0x394) =
               (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x394);
          *(uint *)(local_810.ray + 0x398) =
               (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x398);
          *(uint *)(local_810.ray + 0x39c) =
               (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x39c);
          *(uint *)(local_810.ray + 0x3a0) =
               (uint)(bVar97 & 1) * iVar151 |
               (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 0x3a0);
          *(uint *)(local_810.ray + 0x3a4) =
               (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x3a4);
          *(uint *)(local_810.ray + 0x3a8) =
               (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 0x3a8);
          *(uint *)(local_810.ray + 0x3ac) =
               (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x3ac);
          *(uint *)(local_810.ray + 0x3b0) =
               (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x3b0);
          *(uint *)(local_810.ray + 0x3b4) =
               (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x3b4);
          *(uint *)(local_810.ray + 0x3b8) =
               (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x3b8);
          *(uint *)(local_810.ray + 0x3bc) =
               (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x3bc);
          iVar109 = *(int *)(local_810.hit + 0xc4);
          iVar145 = *(int *)(local_810.hit + 200);
          iVar146 = *(int *)(local_810.hit + 0xcc);
          iVar147 = *(int *)(local_810.hit + 0xd0);
          iVar148 = *(int *)(local_810.hit + 0xd4);
          iVar149 = *(int *)(local_810.hit + 0xd8);
          iVar150 = *(int *)(local_810.hit + 0xdc);
          iVar151 = *(int *)(local_810.hit + 0xe0);
          iVar89 = *(int *)(local_810.hit + 0xe4);
          iVar90 = *(int *)(local_810.hit + 0xe8);
          iVar91 = *(int *)(local_810.hit + 0xec);
          iVar92 = *(int *)(local_810.hit + 0xf0);
          iVar93 = *(int *)(local_810.hit + 0xf4);
          iVar94 = *(int *)(local_810.hit + 0xf8);
          iVar95 = *(int *)(local_810.hit + 0xfc);
          bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
          bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
          bVar21 = (bool)((byte)(uVar96 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar96 >> 10) & 1);
          bVar27 = (bool)((byte)(uVar96 >> 0xb) & 1);
          bVar28 = (bool)((byte)(uVar96 >> 0xc) & 1);
          bVar36 = (bool)((byte)(uVar96 >> 0xd) & 1);
          bVar37 = (bool)((byte)(uVar96 >> 0xe) & 1);
          bVar45 = SUB81(uVar96 >> 0xf,0);
          *(uint *)(local_810.ray + 0x3c0) =
               (uint)(bVar106 & 1) * *(int *)(local_810.hit + 0xc0) |
               (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x3c0);
          *(uint *)(local_810.ray + 0x3c4) =
               (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 0x3c4);
          *(uint *)(local_810.ray + 0x3c8) =
               (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x3c8);
          *(uint *)(local_810.ray + 0x3cc) =
               (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x3cc);
          *(uint *)(local_810.ray + 0x3d0) =
               (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x3d0);
          *(uint *)(local_810.ray + 0x3d4) =
               (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x3d4);
          *(uint *)(local_810.ray + 0x3d8) =
               (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x3d8);
          *(uint *)(local_810.ray + 0x3dc) =
               (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x3dc);
          *(uint *)(local_810.ray + 0x3e0) =
               (uint)(bVar97 & 1) * iVar151 |
               (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 0x3e0);
          *(uint *)(local_810.ray + 0x3e4) =
               (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x3e4);
          *(uint *)(local_810.ray + 1000) =
               (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 1000);
          *(uint *)(local_810.ray + 0x3ec) =
               (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x3ec);
          *(uint *)(local_810.ray + 0x3f0) =
               (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x3f0);
          *(uint *)(local_810.ray + 0x3f4) =
               (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x3f4);
          *(uint *)(local_810.ray + 0x3f8) =
               (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x3f8);
          *(uint *)(local_810.ray + 0x3fc) =
               (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x3fc);
          iVar109 = *(int *)(local_810.hit + 0x104);
          iVar145 = *(int *)(local_810.hit + 0x108);
          iVar146 = *(int *)(local_810.hit + 0x10c);
          iVar147 = *(int *)(local_810.hit + 0x110);
          iVar148 = *(int *)(local_810.hit + 0x114);
          iVar149 = *(int *)(local_810.hit + 0x118);
          iVar150 = *(int *)(local_810.hit + 0x11c);
          iVar151 = *(int *)(local_810.hit + 0x120);
          iVar89 = *(int *)(local_810.hit + 0x124);
          iVar90 = *(int *)(local_810.hit + 0x128);
          iVar91 = *(int *)(local_810.hit + 300);
          iVar92 = *(int *)(local_810.hit + 0x130);
          iVar93 = *(int *)(local_810.hit + 0x134);
          iVar94 = *(int *)(local_810.hit + 0x138);
          iVar95 = *(int *)(local_810.hit + 0x13c);
          bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
          bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
          bVar21 = (bool)((byte)(uVar96 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar96 >> 10) & 1);
          bVar27 = (bool)((byte)(uVar96 >> 0xb) & 1);
          bVar28 = (bool)((byte)(uVar96 >> 0xc) & 1);
          bVar36 = (bool)((byte)(uVar96 >> 0xd) & 1);
          bVar37 = (bool)((byte)(uVar96 >> 0xe) & 1);
          bVar45 = SUB81(uVar96 >> 0xf,0);
          *(uint *)(local_810.ray + 0x400) =
               (uint)(bVar106 & 1) * *(int *)(local_810.hit + 0x100) |
               (uint)!(bool)(bVar106 & 1) * *(int *)(local_810.ray + 0x400);
          *(uint *)(local_810.ray + 0x404) =
               (uint)bVar14 * iVar109 | (uint)!bVar14 * *(int *)(local_810.ray + 0x404);
          *(uint *)(local_810.ray + 0x408) =
               (uint)bVar15 * iVar145 | (uint)!bVar15 * *(int *)(local_810.ray + 0x408);
          *(uint *)(local_810.ray + 0x40c) =
               (uint)bVar16 * iVar146 | (uint)!bVar16 * *(int *)(local_810.ray + 0x40c);
          *(uint *)(local_810.ray + 0x410) =
               (uint)bVar17 * iVar147 | (uint)!bVar17 * *(int *)(local_810.ray + 0x410);
          *(uint *)(local_810.ray + 0x414) =
               (uint)bVar18 * iVar148 | (uint)!bVar18 * *(int *)(local_810.ray + 0x414);
          *(uint *)(local_810.ray + 0x418) =
               (uint)bVar19 * iVar149 | (uint)!bVar19 * *(int *)(local_810.ray + 0x418);
          *(uint *)(local_810.ray + 0x41c) =
               (uint)bVar20 * iVar150 | (uint)!bVar20 * *(int *)(local_810.ray + 0x41c);
          *(uint *)(local_810.ray + 0x420) =
               (uint)(bVar97 & 1) * iVar151 |
               (uint)!(bool)(bVar97 & 1) * *(int *)(local_810.ray + 0x420);
          *(uint *)(local_810.ray + 0x424) =
               (uint)bVar21 * iVar89 | (uint)!bVar21 * *(int *)(local_810.ray + 0x424);
          *(uint *)(local_810.ray + 0x428) =
               (uint)bVar22 * iVar90 | (uint)!bVar22 * *(int *)(local_810.ray + 0x428);
          *(uint *)(local_810.ray + 0x42c) =
               (uint)bVar27 * iVar91 | (uint)!bVar27 * *(int *)(local_810.ray + 0x42c);
          *(uint *)(local_810.ray + 0x430) =
               (uint)bVar28 * iVar92 | (uint)!bVar28 * *(int *)(local_810.ray + 0x430);
          *(uint *)(local_810.ray + 0x434) =
               (uint)bVar36 * iVar93 | (uint)!bVar36 * *(int *)(local_810.ray + 0x434);
          *(uint *)(local_810.ray + 0x438) =
               (uint)bVar37 * iVar94 | (uint)!bVar37 * *(int *)(local_810.ray + 0x438);
          *(uint *)(local_810.ray + 0x43c) =
               (uint)bVar45 * iVar95 | (uint)!bVar45 * *(int *)(local_810.ray + 0x43c);
          auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x140));
          auVar191 = vmovdqu32_avx512f(auVar191);
          *(undefined1 (*) [64])(local_810.ray + 0x440) = auVar191;
          auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x180));
          auVar191 = vmovdqu32_avx512f(auVar191);
          *(undefined1 (*) [64])(local_810.ray + 0x480) = auVar191;
          auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x1c0));
          auVar191 = vmovdqa32_avx512f(auVar191);
          *(undefined1 (*) [64])(local_810.ray + 0x4c0) = auVar191;
          auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x200));
          auVar191 = vmovdqa32_avx512f(auVar191);
          *(undefined1 (*) [64])(local_810.ray + 0x500) = auVar191;
          auVar191 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        }
        uVar189 = auVar191._0_4_;
        auVar153._4_4_ = uVar189;
        auVar153._0_4_ = uVar189;
        auVar153._8_4_ = uVar189;
        auVar153._12_4_ = uVar189;
        auVar153._16_4_ = uVar189;
        auVar153._20_4_ = uVar189;
        auVar153._24_4_ = uVar189;
        auVar153._28_4_ = uVar189;
        uVar96 = vcmpps_avx512vl(auVar163._0_32_,auVar153,2);
        uVar104 = (byte)(~(byte)(1 << (uVar99 & 0x1f)) & (byte)uVar104) & uVar96;
        uVar107 = uVar108;
      }
      bVar106 = (byte)uVar107;
      auVar115 = auVar173._0_32_;
      auVar166 = auVar197._0_32_;
      auVar123 = auVar186._0_32_;
      auVar122 = auVar205._0_32_;
      auVar121 = auVar204._0_32_;
      auVar116 = auVar175._0_32_;
      auVar118 = auVar203._0_32_;
      auVar114 = auVar167._0_32_;
      auVar125 = auVar207._0_32_;
      auVar124 = auVar206._0_32_;
      auVar164 = auVar196._0_32_;
      auVar134 = auVar195._0_32_;
      auVar127 = auVar209._0_32_;
      auVar126 = auVar208._0_32_;
      auVar117 = auVar202._0_32_;
      auVar113 = auVar201._0_32_;
      auVar111 = auVar200._0_32_;
      auVar168 = auVar198._0_32_;
      auVar119 = auVar193._0_32_;
      auVar120 = auVar194._0_32_;
      auVar141 = auVar192._0_32_;
      bVar97 = (byte)uVar104;
      if (bVar97 == 0) goto LAB_0198643a;
      auVar114 = vblendmps_avx512vl(auVar199._0_32_,auVar163._0_32_);
      auVar112._0_4_ =
           (uint)(bVar97 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar97 & 1) * auVar153._0_4_;
      bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * auVar153._4_4_;
      bVar14 = (bool)((byte)(uVar104 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * auVar153._8_4_;
      bVar14 = (bool)((byte)(uVar104 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * auVar153._12_4_;
      bVar14 = (bool)((byte)(uVar104 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * auVar153._16_4_;
      bVar14 = (bool)((byte)(uVar104 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * auVar153._20_4_;
      bVar14 = (bool)((byte)(uVar104 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * auVar153._24_4_;
      bVar14 = SUB81(uVar104 >> 7,0);
      auVar112._28_4_ = (uint)bVar14 * auVar114._28_4_ | (uint)!bVar14 * auVar153._28_4_;
      auVar114 = vshufps_avx(auVar112,auVar112,0xb1);
      auVar114 = vminps_avx(auVar112,auVar114);
      auVar115 = vshufpd_avx(auVar114,auVar114,5);
      auVar114 = vminps_avx(auVar114,auVar115);
      auVar115 = vpermpd_avx2(auVar114,0x4e);
      auVar114 = vminps_avx(auVar114,auVar115);
      uVar77 = vcmpps_avx512vl(auVar112,auVar114,0);
      bVar97 = (byte)uVar77 & bVar97;
      uVar100 = (uint)uVar104;
      if (bVar97 != 0) {
        uVar100 = (uint)bVar97;
      }
      uVar99 = 0;
      for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
        uVar99 = uVar99 + 1;
      }
      goto LAB_01985dc9;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }